

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  byte bVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  ulong uVar75;
  long lVar76;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  Geometry *pGVar77;
  long lVar78;
  undefined8 unaff_R13;
  ulong uVar79;
  byte bVar80;
  float fVar81;
  float fVar82;
  float fVar135;
  float fVar139;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar136;
  float fVar142;
  float fVar143;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar89 [16];
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar144;
  float fVar145;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar146;
  undefined4 uVar147;
  float fVar156;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  RayQueryContext *local_548;
  RayHit *local_540;
  ulong local_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  Precalculations *local_508;
  Primitive *local_500;
  long local_4f8;
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar71 = (ulong)(byte)prim[1];
  fVar167 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar88 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  fVar159 = fVar167 * auVar88._0_4_;
  fVar146 = fVar167 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar87);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar86);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar109 = vpmovsxbd_avx2(auVar85);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar8);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar71 * 0xc + 6);
  auVar106 = vpmovsxbd_avx2(auVar83);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar9);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar96 = vpmovsxbd_avx2(auVar10);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar71 * 0x13 + 6);
  auVar105 = vpmovsxbd_avx2(auVar11);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 * 0x14 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar108 = vcvtdq2ps_avx(auVar97);
  auVar201._4_4_ = fVar146;
  auVar201._0_4_ = fVar146;
  auVar201._8_4_ = fVar146;
  auVar201._12_4_ = fVar146;
  auVar201._16_4_ = fVar146;
  auVar201._20_4_ = fVar146;
  auVar201._24_4_ = fVar146;
  auVar201._28_4_ = fVar146;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar98 = ZEXT1632(CONCAT412(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar146))));
  auVar91 = vpermps_avx512vl(auVar90,auVar98);
  auVar204._8_4_ = 2;
  auVar204._0_8_ = 0x200000002;
  auVar204._12_4_ = 2;
  auVar204._16_4_ = 2;
  auVar204._20_4_ = 2;
  auVar204._24_4_ = 2;
  auVar204._28_4_ = 2;
  auVar98 = vpermps_avx2(auVar204,auVar98);
  fVar146 = auVar98._0_4_;
  auVar182._0_4_ = fVar146 * auVar109._0_4_;
  fVar156 = auVar98._4_4_;
  auVar182._4_4_ = fVar156 * auVar109._4_4_;
  fVar81 = auVar98._8_4_;
  auVar182._8_4_ = fVar81 * auVar109._8_4_;
  fVar82 = auVar98._12_4_;
  auVar182._12_4_ = fVar82 * auVar109._12_4_;
  fVar135 = auVar98._16_4_;
  auVar182._16_4_ = fVar135 * auVar109._16_4_;
  fVar136 = auVar98._20_4_;
  auVar182._20_4_ = fVar136 * auVar109._20_4_;
  fVar139 = auVar98._24_4_;
  auVar182._28_36_ = in_ZMM4._28_36_;
  auVar182._24_4_ = fVar139 * auVar109._24_4_;
  auVar92._4_4_ = auVar94._4_4_ * fVar156;
  auVar92._0_4_ = auVar94._0_4_ * fVar146;
  auVar92._8_4_ = auVar94._8_4_ * fVar81;
  auVar92._12_4_ = auVar94._12_4_ * fVar82;
  auVar92._16_4_ = auVar94._16_4_ * fVar135;
  auVar92._20_4_ = auVar94._20_4_ * fVar136;
  auVar92._24_4_ = auVar94._24_4_ * fVar139;
  auVar92._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar108._4_4_ * fVar156;
  auVar97._0_4_ = auVar108._0_4_ * fVar146;
  auVar97._8_4_ = auVar108._8_4_ * fVar81;
  auVar97._12_4_ = auVar108._12_4_ * fVar82;
  auVar97._16_4_ = auVar108._16_4_ * fVar135;
  auVar97._20_4_ = auVar108._20_4_ * fVar136;
  auVar97._24_4_ = auVar108._24_4_ * fVar139;
  auVar97._28_4_ = auVar98._28_4_;
  auVar87 = vfmadd231ps_fma(auVar182._0_32_,auVar91,auVar93);
  auVar86 = vfmadd231ps_fma(auVar92,auVar91,auVar106);
  auVar85 = vfmadd231ps_fma(auVar97,auVar105,auVar91);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar201,auVar95);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar201,auVar107);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar96,auVar201);
  auVar202._4_4_ = fVar159;
  auVar202._0_4_ = fVar159;
  auVar202._8_4_ = fVar159;
  auVar202._12_4_ = fVar159;
  auVar202._16_4_ = fVar159;
  auVar202._20_4_ = fVar159;
  auVar202._24_4_ = fVar159;
  auVar202._28_4_ = fVar159;
  auVar97 = ZEXT1632(CONCAT412(fVar167 * auVar88._12_4_,
                               CONCAT48(fVar167 * auVar88._8_4_,
                                        CONCAT44(fVar167 * auVar88._4_4_,fVar159))));
  auVar92 = vpermps_avx512vl(auVar90,auVar97);
  auVar97 = vpermps_avx2(auVar204,auVar97);
  fVar167 = auVar97._0_4_;
  fVar146 = auVar97._4_4_;
  auVar98._4_4_ = fVar146 * auVar109._4_4_;
  auVar98._0_4_ = fVar167 * auVar109._0_4_;
  fVar156 = auVar97._8_4_;
  auVar98._8_4_ = fVar156 * auVar109._8_4_;
  fVar81 = auVar97._12_4_;
  auVar98._12_4_ = fVar81 * auVar109._12_4_;
  fVar82 = auVar97._16_4_;
  auVar98._16_4_ = fVar82 * auVar109._16_4_;
  fVar135 = auVar97._20_4_;
  auVar98._20_4_ = fVar135 * auVar109._20_4_;
  fVar136 = auVar97._24_4_;
  auVar98._24_4_ = fVar136 * auVar109._24_4_;
  auVar98._28_4_ = 2;
  auVar90._4_4_ = auVar94._4_4_ * fVar146;
  auVar90._0_4_ = auVar94._0_4_ * fVar167;
  auVar90._8_4_ = auVar94._8_4_ * fVar156;
  auVar90._12_4_ = auVar94._12_4_ * fVar81;
  auVar90._16_4_ = auVar94._16_4_ * fVar82;
  auVar90._20_4_ = auVar94._20_4_ * fVar135;
  auVar90._24_4_ = auVar94._24_4_ * fVar136;
  auVar90._28_4_ = auVar109._28_4_;
  auVar94._4_4_ = auVar108._4_4_ * fVar146;
  auVar94._0_4_ = auVar108._0_4_ * fVar167;
  auVar94._8_4_ = auVar108._8_4_ * fVar156;
  auVar94._12_4_ = auVar108._12_4_ * fVar81;
  auVar94._16_4_ = auVar108._16_4_ * fVar82;
  auVar94._20_4_ = auVar108._20_4_ * fVar135;
  auVar94._24_4_ = auVar108._24_4_ * fVar136;
  auVar94._28_4_ = auVar97._28_4_;
  auVar8 = vfmadd231ps_fma(auVar98,auVar92,auVar93);
  auVar83 = vfmadd231ps_fma(auVar90,auVar92,auVar106);
  auVar9 = vfmadd231ps_fma(auVar94,auVar92,auVar105);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar202,auVar95);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar202,auVar107);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar202,auVar96);
  auVar189._8_4_ = 0x7fffffff;
  auVar189._0_8_ = 0x7fffffff7fffffff;
  auVar189._12_4_ = 0x7fffffff;
  auVar189._16_4_ = 0x7fffffff;
  auVar189._20_4_ = 0x7fffffff;
  auVar189._24_4_ = 0x7fffffff;
  auVar189._28_4_ = 0x7fffffff;
  auVar95 = vandps_avx(ZEXT1632(auVar87),auVar189);
  auVar103._8_4_ = 0x219392ef;
  auVar103._0_8_ = 0x219392ef219392ef;
  auVar103._12_4_ = 0x219392ef;
  auVar103._16_4_ = 0x219392ef;
  auVar103._20_4_ = 0x219392ef;
  auVar103._24_4_ = 0x219392ef;
  auVar103._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar95,auVar103,1);
  bVar14 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._0_4_;
  bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._4_4_;
  bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._8_4_;
  bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar86),auVar189);
  uVar79 = vcmpps_avx512vl(auVar95,auVar103,1);
  bVar14 = (bool)((byte)uVar79 & 1);
  auVar99._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._0_4_;
  bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._4_4_;
  bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._8_4_;
  bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar85),auVar189);
  uVar79 = vcmpps_avx512vl(auVar95,auVar103,1);
  bVar14 = (bool)((byte)uVar79 & 1);
  auVar95._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar85._0_4_;
  bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar85._4_4_;
  bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar85._8_4_;
  bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar85._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = 0x3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar104._16_4_ = 0x3f800000;
  auVar104._20_4_ = 0x3f800000;
  auVar104._24_4_ = 0x3f800000;
  auVar104._28_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar91,auVar93,auVar104);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar99);
  auVar86 = vfnmadd213ps_fma(auVar99,auVar93,auVar104);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar85 = vfnmadd213ps_fma(auVar95,auVar93,auVar104);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar93,auVar93);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar8));
  auVar96._4_4_ = auVar87._4_4_ * auVar95._4_4_;
  auVar96._0_4_ = auVar87._0_4_ * auVar95._0_4_;
  auVar96._8_4_ = auVar87._8_4_ * auVar95._8_4_;
  auVar96._12_4_ = auVar87._12_4_ * auVar95._12_4_;
  auVar96._16_4_ = auVar95._16_4_ * 0.0;
  auVar96._20_4_ = auVar95._20_4_ * 0.0;
  auVar96._24_4_ = auVar95._24_4_ * 0.0;
  auVar96._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar8));
  auVar102._0_4_ = auVar87._0_4_ * auVar95._0_4_;
  auVar102._4_4_ = auVar87._4_4_ * auVar95._4_4_;
  auVar102._8_4_ = auVar87._8_4_ * auVar95._8_4_;
  auVar102._12_4_ = auVar87._12_4_ * auVar95._12_4_;
  auVar102._16_4_ = auVar95._16_4_ * 0.0;
  auVar102._20_4_ = auVar95._20_4_ * 0.0;
  auVar102._24_4_ = auVar95._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xe + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar83));
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar105._4_4_ = auVar86._4_4_ * auVar95._4_4_;
  auVar105._0_4_ = auVar86._0_4_ * auVar95._0_4_;
  auVar105._8_4_ = auVar86._8_4_ * auVar95._8_4_;
  auVar105._12_4_ = auVar86._12_4_ * auVar95._12_4_;
  auVar105._16_4_ = auVar95._16_4_ * 0.0;
  auVar105._20_4_ = auVar95._20_4_ * 0.0;
  auVar105._24_4_ = auVar95._24_4_ * 0.0;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar93);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar83));
  auVar101._0_4_ = auVar86._0_4_ * auVar95._0_4_;
  auVar101._4_4_ = auVar86._4_4_ * auVar95._4_4_;
  auVar101._8_4_ = auVar86._8_4_ * auVar95._8_4_;
  auVar101._12_4_ = auVar86._12_4_ * auVar95._12_4_;
  auVar101._16_4_ = auVar95._16_4_ * 0.0;
  auVar101._20_4_ = auVar95._20_4_ * 0.0;
  auVar101._24_4_ = auVar95._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x15 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar9));
  auVar108._4_4_ = auVar95._4_4_ * auVar85._4_4_;
  auVar108._0_4_ = auVar95._0_4_ * auVar85._0_4_;
  auVar108._8_4_ = auVar95._8_4_ * auVar85._8_4_;
  auVar108._12_4_ = auVar95._12_4_ * auVar85._12_4_;
  auVar108._16_4_ = auVar95._16_4_ * 0.0;
  auVar108._20_4_ = auVar95._20_4_ * 0.0;
  auVar108._24_4_ = auVar95._24_4_ * 0.0;
  auVar108._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar9));
  auVar100._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar100._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar100._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar100._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar100._16_4_ = auVar95._16_4_ * 0.0;
  auVar100._20_4_ = auVar95._20_4_ * 0.0;
  auVar100._24_4_ = auVar95._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar96,auVar102);
  auVar93 = vpminsd_avx2(auVar105,auVar101);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx2(auVar108,auVar100);
  uVar147 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar109._4_4_ = uVar147;
  auVar109._0_4_ = uVar147;
  auVar109._8_4_ = uVar147;
  auVar109._12_4_ = uVar147;
  auVar109._16_4_ = uVar147;
  auVar109._20_4_ = uVar147;
  auVar109._24_4_ = uVar147;
  auVar109._28_4_ = uVar147;
  auVar93 = vmaxps_avx512vl(auVar93,auVar109);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar95,auVar93);
  auVar95 = vpmaxsd_avx2(auVar96,auVar102);
  auVar93 = vpmaxsd_avx2(auVar105,auVar101);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx2(auVar108,auVar100);
  fVar167 = (ray->super_RayK<1>).tfar;
  auVar107._4_4_ = fVar167;
  auVar107._0_4_ = fVar167;
  auVar107._8_4_ = fVar167;
  auVar107._12_4_ = fVar167;
  auVar107._16_4_ = fVar167;
  auVar107._20_4_ = fVar167;
  auVar107._24_4_ = fVar167;
  auVar107._28_4_ = fVar167;
  auVar93 = vminps_avx512vl(auVar93,auVar107);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar106);
  uVar20 = vcmpps_avx512vl(local_80,auVar95,2);
  uVar22 = vpcmpgtd_avx512vl(auVar94,_DAT_01fb4ba0);
  uVar79 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar20 & (byte)uVar22));
  local_540 = ray;
  local_548 = context;
  local_500 = prim;
  local_508 = pre;
  do {
    auVar95 = local_460;
    if (uVar79 == 0) {
      return;
    }
    lVar76 = 0;
    for (uVar71 = uVar79; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      lVar76 = lVar76 + 1;
    }
    uVar73 = *(uint *)(prim + 2);
    uVar74 = *(uint *)(prim + lVar76 * 4 + 6);
    local_550 = (ulong)uVar73;
    pGVar77 = (context->scene->geometries).items[uVar73].ptr;
    local_538 = (ulong)uVar74;
    uVar71 = (ulong)*(uint *)(*(long *)&pGVar77->field_0x58 +
                             pGVar77[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar74);
    p_Var13 = pGVar77[1].intersectionFilterN;
    lVar76 = *(long *)&pGVar77[1].time_range.upper;
    local_4b0 = *(undefined1 (*) [16])(lVar76 + (long)p_Var13 * uVar71);
    local_4c0 = *(undefined1 (*) [16])(lVar76 + (uVar71 + 1) * (long)p_Var13);
    pauVar3 = (undefined1 (*) [16])(lVar76 + (uVar71 + 2) * (long)p_Var13);
    auVar87 = *pauVar3;
    local_520 = *(undefined8 *)*pauVar3;
    uStack_518 = *(undefined8 *)(*pauVar3 + 8);
    uVar79 = uVar79 - 1 & uVar79;
    pauVar4 = (undefined1 (*) [12])(lVar76 + (uVar71 + 3) * (long)p_Var13);
    local_220 = *(undefined8 *)*pauVar4;
    uStack_218 = *(undefined8 *)(*pauVar4 + 8);
    local_530 = (float)local_220;
    fStack_52c = (float)((ulong)local_220 >> 0x20);
    fStack_528 = (float)uStack_218;
    fStack_524 = (float)((ulong)uStack_218 >> 0x20);
    if (uVar79 != 0) {
      uVar75 = uVar79 - 1 & uVar79;
      for (uVar71 = uVar79; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
      if (uVar75 != 0) {
        for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar12 = (int)pGVar77[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (ray->super_RayK<1>).org.field_0;
    auVar85 = vsubps_avx(local_4b0,(undefined1  [16])aVar5);
    uVar147 = auVar85._0_4_;
    auVar157._4_4_ = uVar147;
    auVar157._0_4_ = uVar147;
    auVar157._8_4_ = uVar147;
    auVar157._12_4_ = uVar147;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    aVar6 = (pre->ray_space).vx.field_0;
    aVar7 = (pre->ray_space).vy.field_0;
    fVar167 = (pre->ray_space).vz.field_0.m128[0];
    fVar146 = (pre->ray_space).vz.field_0.m128[1];
    fVar156 = (pre->ray_space).vz.field_0.m128[2];
    fVar81 = (pre->ray_space).vz.field_0.m128[3];
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar191._0_4_ = auVar85._0_4_ * fVar167;
    auVar191._4_4_ = auVar85._4_4_ * fVar146;
    auVar191._8_4_ = auVar85._8_4_ * fVar156;
    auVar191._12_4_ = auVar85._12_4_ * fVar81;
    auVar86 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar7,auVar86);
    auVar9 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar6,auVar157);
    auVar86 = vshufps_avx(local_4b0,local_4b0,0xff);
    auVar8 = vsubps_avx(local_4c0,(undefined1  [16])aVar5);
    uVar147 = auVar8._0_4_;
    auVar160._4_4_ = uVar147;
    auVar160._0_4_ = uVar147;
    auVar160._8_4_ = uVar147;
    auVar160._12_4_ = uVar147;
    auVar85 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar192._0_4_ = auVar8._0_4_ * fVar167;
    auVar192._4_4_ = auVar8._4_4_ * fVar146;
    auVar192._8_4_ = auVar8._8_4_ * fVar156;
    auVar192._12_4_ = auVar8._12_4_ * fVar81;
    auVar85 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar85);
    auVar10 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar160);
    auVar85 = vshufps_avx(local_4c0,local_4c0,0xff);
    auVar83 = vsubps_avx512vl(auVar87,(undefined1  [16])aVar5);
    uVar147 = auVar83._0_4_;
    auVar188._4_4_ = uVar147;
    auVar188._0_4_ = uVar147;
    auVar188._8_4_ = uVar147;
    auVar188._12_4_ = uVar147;
    auVar8 = vshufps_avx(auVar83,auVar83,0x55);
    auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar195._0_4_ = auVar83._0_4_ * fVar167;
    auVar195._4_4_ = auVar83._4_4_ * fVar146;
    auVar195._8_4_ = auVar83._8_4_ * fVar156;
    auVar195._12_4_ = auVar83._12_4_ * fVar81;
    auVar8 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar7,auVar8);
    auVar11 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar188);
    auVar84 = vshufps_avx512vl(auVar87,auVar87,0xff);
    auVar88._12_4_ = fStack_524;
    auVar88._0_12_ = *pauVar4;
    local_3e0 = ZEXT1632((undefined1  [16])aVar5);
    auVar83 = vsubps_avx512vl(auVar88,(undefined1  [16])aVar5);
    uVar147 = auVar83._0_4_;
    auVar89._4_4_ = uVar147;
    auVar89._0_4_ = uVar147;
    auVar89._8_4_ = uVar147;
    auVar89._12_4_ = uVar147;
    auVar8 = vshufps_avx(auVar83,auVar83,0x55);
    auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar200._0_4_ = auVar83._0_4_ * fVar167;
    auVar200._4_4_ = auVar83._4_4_ * fVar146;
    auVar200._8_4_ = auVar83._8_4_ * fVar156;
    auVar200._12_4_ = auVar83._12_4_ * fVar81;
    auVar8 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar7,auVar8);
    auVar8 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar89);
    local_4f8 = (long)iVar12;
    lVar76 = local_4f8 * 0x44;
    auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76);
    uVar147 = auVar9._0_4_;
    local_2e0._4_4_ = uVar147;
    local_2e0._0_4_ = uVar147;
    local_2e0._8_4_ = uVar147;
    local_2e0._12_4_ = uVar147;
    local_2e0._16_4_ = uVar147;
    local_2e0._20_4_ = uVar147;
    local_2e0._24_4_ = uVar147;
    local_2e0._28_4_ = uVar147;
    auVar148._8_4_ = 1;
    auVar148._0_8_ = 0x100000001;
    auVar148._12_4_ = 1;
    auVar148._16_4_ = 1;
    auVar148._20_4_ = 1;
    auVar148._24_4_ = 1;
    auVar148._28_4_ = 1;
    local_300 = vpermps_avx512vl(auVar148,ZEXT1632(auVar9));
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0x484);
    local_320 = vbroadcastss_avx512vl(auVar10);
    local_340 = vpermps_avx512vl(auVar148,ZEXT1632(auVar10));
    auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar11);
    local_380 = vpermps_avx512vl(auVar148,ZEXT1632(auVar11));
    auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0xd8c);
    uVar147 = auVar8._0_4_;
    local_3a0._4_4_ = uVar147;
    local_3a0._0_4_ = uVar147;
    fStack_398 = (float)uVar147;
    fStack_394 = (float)uVar147;
    fStack_390 = (float)uVar147;
    fStack_38c = (float)uVar147;
    fStack_388 = (float)uVar147;
    register0x0000139c = uVar147;
    _local_3c0 = vpermps_avx512vl(auVar148,ZEXT1632(auVar8));
    auVar94 = vmulps_avx512vl(_local_3a0,auVar106);
    auVar96 = vmulps_avx512vl(_local_3c0,auVar106);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_360);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_380);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_320);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_340);
    auVar97 = vfmadd231ps_avx512vl(auVar94,auVar93,local_2e0);
    auVar187 = ZEXT3264(auVar97);
    auVar98 = vfmadd231ps_avx512vl(auVar96,auVar93,local_300);
    auVar182 = ZEXT3264(auVar98);
    auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76);
    auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0x484);
    auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0x908);
    auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0xd8c);
    auVar92 = vmulps_avx512vl(_local_3a0,auVar108);
    auVar90 = vmulps_avx512vl(_local_3c0,auVar108);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_360);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar105,local_380);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,local_320);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_340);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,local_2e0);
    auVar190 = ZEXT3264(auVar92);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_300);
    auVar91 = vsubps_avx512vl(auVar92,auVar97);
    auVar99 = vsubps_avx512vl(auVar90,auVar98);
    auVar100 = vmulps_avx512vl(auVar98,auVar91);
    auVar101 = vmulps_avx512vl(auVar97,auVar99);
    auVar100 = vsubps_avx512vl(auVar100,auVar101);
    auVar83 = vshufps_avx512vl(auVar88,auVar88,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar86);
    local_c0 = vbroadcastsd_avx512vl(auVar85);
    local_e0 = vbroadcastsd_avx512vl(auVar84);
    local_100 = vbroadcastsd_avx512vl(auVar83);
    auVar101 = vmulps_avx512vl(local_100,auVar106);
    auVar86 = vfmadd231ps_fma(auVar101,auVar107,local_e0);
    auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar109,local_c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
    auVar102 = vmulps_avx512vl(local_100,auVar108);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,local_c0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_a0);
    auVar103 = vmulps_avx512vl(auVar99,auVar99);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar91);
    auVar104 = vmaxps_avx512vl(auVar101,auVar102);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    uVar20 = vcmpps_avx512vl(auVar100,auVar103,2);
    auVar86 = vblendps_avx(auVar9,local_4b0,8);
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar83 = vandps_avx512vl(auVar86,auVar85);
    auVar86 = vblendps_avx(auVar10,local_4c0,8);
    auVar86 = vandps_avx512vl(auVar86,auVar85);
    auVar86 = vmaxps_avx(auVar83,auVar86);
    auVar87 = vblendps_avx(auVar11,auVar87,8);
    auVar83 = vandps_avx512vl(auVar87,auVar85);
    auVar87 = vblendps_avx(auVar8,auVar88,8);
    auVar87 = vandps_avx512vl(auVar87,auVar85);
    auVar87 = vmaxps_avx(auVar83,auVar87);
    auVar87 = vmaxps_avx(auVar86,auVar87);
    auVar86 = vmovshdup_avx(auVar87);
    auVar86 = vmaxss_avx(auVar86,auVar87);
    auVar87 = vshufpd_avx(auVar87,auVar87,1);
    auVar87 = vmaxss_avx(auVar87,auVar86);
    auVar197._0_4_ = (float)iVar12;
    local_460._4_12_ = auVar9._4_12_;
    local_460._0_4_ = auVar197._0_4_;
    local_460._16_16_ = auVar95._16_16_;
    auVar197._4_4_ = auVar197._0_4_;
    auVar197._8_4_ = auVar197._0_4_;
    auVar197._12_4_ = auVar197._0_4_;
    auVar197._16_4_ = auVar197._0_4_;
    auVar197._20_4_ = auVar197._0_4_;
    auVar197._24_4_ = auVar197._0_4_;
    auVar197._28_4_ = auVar197._0_4_;
    uVar22 = vcmpps_avx512vl(auVar197,_DAT_01f7b060,0xe);
    bVar80 = (byte)uVar20 & (byte)uVar22;
    fVar167 = auVar87._0_4_ * 4.7683716e-07;
    local_440._0_16_ = ZEXT416((uint)fVar167);
    auVar198._8_4_ = 2;
    auVar198._0_8_ = 0x200000002;
    auVar198._12_4_ = 2;
    auVar198._16_4_ = 2;
    auVar198._20_4_ = 2;
    auVar198._24_4_ = 2;
    auVar198._28_4_ = 2;
    local_140 = vpermps_avx2(auVar198,ZEXT1632(auVar9));
    local_160 = vpermps_avx2(auVar198,ZEXT1632(auVar10));
    local_180 = vpermps_avx2(auVar198,ZEXT1632(auVar11));
    local_1a0 = vpermps_avx2(auVar198,ZEXT1632(auVar8));
    if (bVar80 != 0) {
      auVar95 = vmulps_avx512vl(local_1a0,auVar108);
      auVar95 = vfmadd213ps_avx512vl(auVar105,local_180,auVar95);
      auVar95 = vfmadd213ps_avx512vl(auVar96,local_160,auVar95);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar95);
      auVar95 = vmulps_avx512vl(local_1a0,auVar106);
      auVar95 = vfmadd213ps_avx512vl(auVar107,local_180,auVar95);
      auVar96 = vfmadd213ps_avx512vl(auVar109,local_160,auVar95);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0x1694);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0x1b18);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 + 0x1f9c);
      auVar96 = vfmadd213ps_avx512vl(auVar93,local_140,auVar96);
      auVar93 = vmulps_avx512vl(_local_3a0,auVar106);
      auVar105 = vmulps_avx512vl(_local_3c0,auVar106);
      auVar106 = vmulps_avx512vl(local_1a0,auVar106);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_360);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_380);
      auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar109,local_320);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar109,local_340);
      auVar105 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
      auVar87 = vfmadd231ps_fma(auVar93,auVar95,local_2e0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar95,local_300);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0x1b18);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0x1f9c);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_140,auVar95);
      auVar95 = vmulps_avx512vl(_local_3a0,auVar107);
      auVar108 = vmulps_avx512vl(_local_3c0,auVar107);
      auVar107 = vmulps_avx512vl(local_1a0,auVar107);
      auVar100 = vfmadd231ps_avx512vl(auVar95,auVar109,local_360);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar109,local_380);
      auVar109 = vfmadd231ps_avx512vl(auVar107,local_180,auVar109);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 + 0x1694);
      auVar107 = vfmadd231ps_avx512vl(auVar100,auVar95,local_320);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,local_340);
      auVar95 = vfmadd231ps_avx512vl(auVar109,local_160,auVar95);
      auVar86 = vfmadd231ps_fma(auVar107,auVar93,local_2e0);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar93,local_300);
      auVar107 = vfmadd231ps_avx512vl(auVar95,local_140,auVar93);
      auVar205._8_4_ = 0x7fffffff;
      auVar205._0_8_ = 0x7fffffff7fffffff;
      auVar205._12_4_ = 0x7fffffff;
      auVar205._16_4_ = 0x7fffffff;
      auVar205._20_4_ = 0x7fffffff;
      auVar205._24_4_ = 0x7fffffff;
      auVar205._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(ZEXT1632(auVar87),auVar205);
      auVar93 = vandps_avx(auVar106,auVar205);
      auVar93 = vmaxps_avx(auVar95,auVar93);
      auVar95 = vandps_avx(auVar105,auVar205);
      auVar95 = vmaxps_avx(auVar93,auVar95);
      auVar199._4_4_ = fVar167;
      auVar199._0_4_ = fVar167;
      auVar199._8_4_ = fVar167;
      auVar199._12_4_ = fVar167;
      auVar199._16_4_ = fVar167;
      auVar199._20_4_ = fVar167;
      auVar199._24_4_ = fVar167;
      auVar199._28_4_ = fVar167;
      uVar71 = vcmpps_avx512vl(auVar95,auVar199,1);
      bVar14 = (bool)((byte)uVar71 & 1);
      auVar110._0_4_ = (float)((uint)bVar14 * auVar91._0_4_ | (uint)!bVar14 * auVar87._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar87._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar87._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar87._12_4_);
      fVar167 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
      auVar110._16_4_ = fVar167;
      fVar146 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
      auVar110._20_4_ = fVar146;
      fVar156 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
      auVar110._24_4_ = fVar156;
      uVar72 = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
      auVar110._28_4_ = uVar72;
      bVar14 = (bool)((byte)uVar71 & 1);
      auVar111._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar106._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar106._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar106._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar106._12_4_);
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar106._16_4_);
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar106._20_4_);
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar106._24_4_);
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar111._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar106._28_4_;
      auVar95 = vandps_avx(auVar205,ZEXT1632(auVar86));
      auVar93 = vandps_avx(auVar109,auVar205);
      auVar93 = vmaxps_avx(auVar95,auVar93);
      auVar95 = vandps_avx(auVar107,auVar205);
      auVar95 = vmaxps_avx(auVar93,auVar95);
      uVar71 = vcmpps_avx512vl(auVar95,auVar199,1);
      bVar14 = (bool)((byte)uVar71 & 1);
      auVar112._0_4_ = (float)((uint)bVar14 * auVar91._0_4_ | (uint)!bVar14 * auVar86._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar86._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar86._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar86._12_4_);
      fVar82 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
      auVar112._16_4_ = fVar82;
      fVar135 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
      auVar112._20_4_ = fVar135;
      fVar81 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
      auVar112._24_4_ = fVar81;
      auVar112._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
      bVar14 = (bool)((byte)uVar71 & 1);
      auVar113._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar109._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar109._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar109._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar109._12_4_);
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar109._16_4_);
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar109._20_4_);
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar109._24_4_);
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar113._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar109._28_4_;
      auVar88 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
      auVar95 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar88));
      auVar87 = vfmadd231ps_fma(auVar95,auVar111,auVar111);
      auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
      fVar136 = auVar95._0_4_;
      fVar139 = auVar95._4_4_;
      fVar159 = auVar95._8_4_;
      fVar142 = auVar95._12_4_;
      fVar143 = auVar95._16_4_;
      fVar137 = auVar95._20_4_;
      fVar138 = auVar95._24_4_;
      auVar35._4_4_ = fVar139 * fVar139 * fVar139 * auVar87._4_4_ * -0.5;
      auVar35._0_4_ = fVar136 * fVar136 * fVar136 * auVar87._0_4_ * -0.5;
      auVar35._8_4_ = fVar159 * fVar159 * fVar159 * auVar87._8_4_ * -0.5;
      auVar35._12_4_ = fVar142 * fVar142 * fVar142 * auVar87._12_4_ * -0.5;
      auVar35._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
      auVar35._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar35._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar35._28_4_ = 0;
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar109 = vfmadd231ps_avx512vl(auVar35,auVar93,auVar95);
      auVar36._4_4_ = auVar111._4_4_ * auVar109._4_4_;
      auVar36._0_4_ = auVar111._0_4_ * auVar109._0_4_;
      auVar36._8_4_ = auVar111._8_4_ * auVar109._8_4_;
      auVar36._12_4_ = auVar111._12_4_ * auVar109._12_4_;
      auVar36._16_4_ = auVar111._16_4_ * auVar109._16_4_;
      auVar36._20_4_ = auVar111._20_4_ * auVar109._20_4_;
      auVar36._24_4_ = auVar111._24_4_ * auVar109._24_4_;
      auVar36._28_4_ = auVar95._28_4_;
      auVar37._4_4_ = auVar109._4_4_ * -auVar110._4_4_;
      auVar37._0_4_ = auVar109._0_4_ * -auVar110._0_4_;
      auVar37._8_4_ = auVar109._8_4_ * -auVar110._8_4_;
      auVar37._12_4_ = auVar109._12_4_ * -auVar110._12_4_;
      auVar37._16_4_ = auVar109._16_4_ * -fVar167;
      auVar37._20_4_ = auVar109._20_4_ * -fVar146;
      auVar37._24_4_ = auVar109._24_4_ * -fVar156;
      auVar37._28_4_ = uVar72 ^ 0x80000000;
      auVar95 = vmulps_avx512vl(auVar109,ZEXT1632(auVar88));
      auVar91 = ZEXT1632(auVar88);
      auVar107 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar91);
      auVar87 = vfmadd231ps_fma(auVar107,auVar113,auVar113);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
      fVar167 = auVar107._0_4_;
      fVar146 = auVar107._4_4_;
      fVar156 = auVar107._8_4_;
      fVar136 = auVar107._12_4_;
      fVar139 = auVar107._16_4_;
      fVar159 = auVar107._20_4_;
      fVar142 = auVar107._24_4_;
      auVar38._4_4_ = fVar146 * fVar146 * fVar146 * auVar87._4_4_ * -0.5;
      auVar38._0_4_ = fVar167 * fVar167 * fVar167 * auVar87._0_4_ * -0.5;
      auVar38._8_4_ = fVar156 * fVar156 * fVar156 * auVar87._8_4_ * -0.5;
      auVar38._12_4_ = fVar136 * fVar136 * fVar136 * auVar87._12_4_ * -0.5;
      auVar38._16_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar38._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar38._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar38._28_4_ = 0;
      auVar93 = vfmadd231ps_avx512vl(auVar38,auVar93,auVar107);
      auVar39._4_4_ = auVar113._4_4_ * auVar93._4_4_;
      auVar39._0_4_ = auVar113._0_4_ * auVar93._0_4_;
      auVar39._8_4_ = auVar113._8_4_ * auVar93._8_4_;
      auVar39._12_4_ = auVar113._12_4_ * auVar93._12_4_;
      auVar39._16_4_ = auVar113._16_4_ * auVar93._16_4_;
      auVar39._20_4_ = auVar113._20_4_ * auVar93._20_4_;
      auVar39._24_4_ = auVar113._24_4_ * auVar93._24_4_;
      auVar39._28_4_ = auVar107._28_4_;
      auVar40._4_4_ = -auVar112._4_4_ * auVar93._4_4_;
      auVar40._0_4_ = -auVar112._0_4_ * auVar93._0_4_;
      auVar40._8_4_ = -auVar112._8_4_ * auVar93._8_4_;
      auVar40._12_4_ = -auVar112._12_4_ * auVar93._12_4_;
      auVar40._16_4_ = -fVar82 * auVar93._16_4_;
      auVar40._20_4_ = -fVar135 * auVar93._20_4_;
      auVar40._24_4_ = -fVar81 * auVar93._24_4_;
      auVar40._28_4_ = auVar109._28_4_;
      auVar93 = vmulps_avx512vl(auVar93,auVar91);
      auVar87 = vfmadd213ps_fma(auVar36,auVar101,auVar97);
      auVar86 = vfmadd213ps_fma(auVar37,auVar101,auVar98);
      auVar109 = vfmadd213ps_avx512vl(auVar95,auVar101,auVar96);
      auVar107 = vfmadd213ps_avx512vl(auVar39,auVar102,auVar92);
      auVar9 = vfnmadd213ps_fma(auVar36,auVar101,auVar97);
      auVar85 = vfmadd213ps_fma(auVar40,auVar102,auVar90);
      auVar10 = vfnmadd213ps_fma(auVar37,auVar101,auVar98);
      auVar106 = vfmadd213ps_avx512vl(auVar93,auVar102,auVar94);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar101,auVar95);
      auVar11 = vfnmadd213ps_fma(auVar39,auVar102,auVar92);
      auVar84 = vfnmadd213ps_fma(auVar40,auVar102,auVar90);
      auVar93 = vfnmadd231ps_avx512vl(auVar94,auVar102,auVar93);
      auVar94 = vsubps_avx512vl(auVar107,ZEXT1632(auVar9));
      auVar95 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar10));
      auVar105 = vsubps_avx512vl(auVar106,auVar96);
      auVar108 = vmulps_avx512vl(auVar95,auVar96);
      auVar8 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar10),auVar105);
      auVar41._4_4_ = auVar9._4_4_ * auVar105._4_4_;
      auVar41._0_4_ = auVar9._0_4_ * auVar105._0_4_;
      auVar41._8_4_ = auVar9._8_4_ * auVar105._8_4_;
      auVar41._12_4_ = auVar9._12_4_ * auVar105._12_4_;
      auVar41._16_4_ = auVar105._16_4_ * 0.0;
      auVar41._20_4_ = auVar105._20_4_ * 0.0;
      auVar41._24_4_ = auVar105._24_4_ * 0.0;
      auVar41._28_4_ = auVar105._28_4_;
      auVar105 = vfmsub231ps_avx512vl(auVar41,auVar96,auVar94);
      auVar42._4_4_ = auVar10._4_4_ * auVar94._4_4_;
      auVar42._0_4_ = auVar10._0_4_ * auVar94._0_4_;
      auVar42._8_4_ = auVar10._8_4_ * auVar94._8_4_;
      auVar42._12_4_ = auVar10._12_4_ * auVar94._12_4_;
      auVar42._16_4_ = auVar94._16_4_ * 0.0;
      auVar42._20_4_ = auVar94._20_4_ * 0.0;
      auVar42._24_4_ = auVar94._24_4_ * 0.0;
      auVar42._28_4_ = auVar94._28_4_;
      auVar83 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar9),auVar95);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar91,auVar105);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,ZEXT1632(auVar8));
      auVar92 = ZEXT1632(auVar88);
      uVar71 = vcmpps_avx512vl(auVar95,auVar92,2);
      bVar70 = (byte)uVar71;
      fVar81 = (float)((uint)(bVar70 & 1) * auVar87._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar11._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      fVar135 = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar11._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      fVar139 = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar11._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      fVar142 = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar11._12_4_);
      auVar94 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar139,CONCAT44(fVar135,fVar81))));
      fVar82 = (float)((uint)(bVar70 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar84._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      fVar136 = (float)((uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar84._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      fVar159 = (float)((uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar84._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      fVar143 = (float)((uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar84._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar159,CONCAT44(fVar136,fVar82))));
      auVar114._0_4_ =
           (uint)(bVar70 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar93._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar93._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar93._12_4_;
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * auVar93._16_4_;
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * auVar93._20_4_;
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * auVar93._24_4_;
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar114._28_4_ = (uint)bVar14 * auVar109._28_4_ | (uint)!bVar14 * auVar93._28_4_;
      auVar93 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar107);
      auVar115._0_4_ =
           (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar86._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar86._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar86._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar86._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_;
      auVar115._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
      auVar93 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar85));
      auVar116._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar8._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar8._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar8._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar8._12_4_);
      fVar167 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_);
      auVar116._16_4_ = fVar167;
      fVar156 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_);
      auVar116._20_4_ = fVar156;
      fVar146 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_);
      auVar116._24_4_ = fVar146;
      auVar116._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
      auVar93 = vblendmps_avx512vl(auVar96,auVar106);
      auVar117._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar109._0_4_);
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar109._4_4_);
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar109._8_4_);
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar109._12_4_);
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * auVar109._16_4_);
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * auVar109._20_4_);
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * auVar109._24_4_);
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar117._28_4_ = (uint)bVar14 * auVar93._28_4_ | (uint)!bVar14 * auVar109._28_4_;
      auVar118._0_4_ =
           (uint)(bVar70 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar107._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar14 * (int)auVar9._4_4_ | (uint)!bVar14 * auVar107._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar14 * (int)auVar9._8_4_ | (uint)!bVar14 * auVar107._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar14 * (int)auVar9._12_4_ | (uint)!bVar14 * auVar107._12_4_;
      auVar118._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar107._16_4_;
      auVar118._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar107._20_4_;
      auVar118._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar107._24_4_;
      auVar118._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar107._28_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar119._0_4_ =
           (uint)(bVar70 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar106._0_4_;
      bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * auVar106._4_4_;
      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * auVar106._8_4_;
      bVar15 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * auVar106._12_4_;
      bVar15 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar15 * auVar96._16_4_ | (uint)!bVar15 * auVar106._16_4_;
      bVar15 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar15 * auVar96._20_4_ | (uint)!bVar15 * auVar106._20_4_;
      bVar15 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar15 * auVar96._24_4_ | (uint)!bVar15 * auVar106._24_4_;
      bVar15 = SUB81(uVar71 >> 7,0);
      auVar119._28_4_ = (uint)bVar15 * auVar96._28_4_ | (uint)!bVar15 * auVar106._28_4_;
      auVar106 = vsubps_avx512vl(auVar118,auVar94);
      auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar10._12_4_ |
                                              (uint)!bVar17 * auVar85._12_4_,
                                              CONCAT48((uint)bVar16 * (int)auVar10._8_4_ |
                                                       (uint)!bVar16 * auVar85._8_4_,
                                                       CONCAT44((uint)bVar14 * (int)auVar10._4_4_ |
                                                                (uint)!bVar14 * auVar85._4_4_,
                                                                (uint)(bVar70 & 1) *
                                                                (int)auVar10._0_4_ |
                                                                (uint)!(bool)(bVar70 & 1) *
                                                                auVar85._0_4_)))),auVar105);
      auVar187 = ZEXT3264(auVar93);
      auVar96 = vsubps_avx512vl(auVar119,auVar114);
      auVar109 = vsubps_avx(auVar94,auVar115);
      auVar190 = ZEXT3264(auVar109);
      auVar107 = vsubps_avx(auVar105,auVar116);
      auVar108 = vsubps_avx512vl(auVar114,auVar117);
      auVar43._4_4_ = auVar96._4_4_ * fVar135;
      auVar43._0_4_ = auVar96._0_4_ * fVar81;
      auVar43._8_4_ = auVar96._8_4_ * fVar139;
      auVar43._12_4_ = auVar96._12_4_ * fVar142;
      auVar43._16_4_ = auVar96._16_4_ * 0.0;
      auVar43._20_4_ = auVar96._20_4_ * 0.0;
      auVar43._24_4_ = auVar96._24_4_ * 0.0;
      auVar43._28_4_ = auVar119._28_4_;
      auVar97 = vfmsub231ps_avx512vl(auVar43,auVar114,auVar106);
      auVar44._4_4_ = fVar136 * auVar106._4_4_;
      auVar44._0_4_ = fVar82 * auVar106._0_4_;
      auVar44._8_4_ = fVar159 * auVar106._8_4_;
      auVar44._12_4_ = fVar143 * auVar106._12_4_;
      auVar44._16_4_ = auVar106._16_4_ * 0.0;
      auVar44._20_4_ = auVar106._20_4_ * 0.0;
      auVar44._24_4_ = auVar106._24_4_ * 0.0;
      auVar44._28_4_ = auVar95._28_4_;
      auVar87 = vfmsub231ps_fma(auVar44,auVar94,auVar93);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar92,auVar97);
      auVar97 = vmulps_avx512vl(auVar93,auVar114);
      auVar87 = vfmsub231ps_fma(auVar97,auVar105,auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar95,auVar92,ZEXT1632(auVar87));
      auVar95 = vmulps_avx512vl(auVar108,auVar115);
      auVar95 = vfmsub231ps_avx512vl(auVar95,auVar109,auVar117);
      auVar45._4_4_ = auVar107._4_4_ * auVar117._4_4_;
      auVar45._0_4_ = auVar107._0_4_ * auVar117._0_4_;
      auVar45._8_4_ = auVar107._8_4_ * auVar117._8_4_;
      auVar45._12_4_ = auVar107._12_4_ * auVar117._12_4_;
      auVar45._16_4_ = auVar107._16_4_ * auVar117._16_4_;
      auVar45._20_4_ = auVar107._20_4_ * auVar117._20_4_;
      auVar45._24_4_ = auVar107._24_4_ * auVar117._24_4_;
      auVar45._28_4_ = auVar117._28_4_;
      auVar87 = vfmsub231ps_fma(auVar45,auVar116,auVar108);
      auVar179._0_4_ = auVar116._0_4_ * auVar109._0_4_;
      auVar179._4_4_ = auVar116._4_4_ * auVar109._4_4_;
      auVar179._8_4_ = auVar116._8_4_ * auVar109._8_4_;
      auVar179._12_4_ = auVar116._12_4_ * auVar109._12_4_;
      auVar179._16_4_ = fVar167 * auVar109._16_4_;
      auVar179._20_4_ = fVar156 * auVar109._20_4_;
      auVar179._24_4_ = fVar146 * auVar109._24_4_;
      auVar179._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar179,auVar107,auVar115);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,auVar95);
      auVar98 = vfmadd231ps_avx512vl(auVar95,auVar92,ZEXT1632(auVar87));
      auVar182 = ZEXT3264(auVar98);
      auVar95 = vmaxps_avx(auVar97,auVar98);
      uVar20 = vcmpps_avx512vl(auVar95,auVar92,2);
      bVar80 = bVar80 & (byte)uVar20;
      if (bVar80 != 0) {
        auVar46._4_4_ = auVar108._4_4_ * auVar93._4_4_;
        auVar46._0_4_ = auVar108._0_4_ * auVar93._0_4_;
        auVar46._8_4_ = auVar108._8_4_ * auVar93._8_4_;
        auVar46._12_4_ = auVar108._12_4_ * auVar93._12_4_;
        auVar46._16_4_ = auVar108._16_4_ * auVar93._16_4_;
        auVar46._20_4_ = auVar108._20_4_ * auVar93._20_4_;
        auVar46._24_4_ = auVar108._24_4_ * auVar93._24_4_;
        auVar46._28_4_ = auVar95._28_4_;
        auVar8 = vfmsub231ps_fma(auVar46,auVar107,auVar96);
        auVar47._4_4_ = auVar96._4_4_ * auVar109._4_4_;
        auVar47._0_4_ = auVar96._0_4_ * auVar109._0_4_;
        auVar47._8_4_ = auVar96._8_4_ * auVar109._8_4_;
        auVar47._12_4_ = auVar96._12_4_ * auVar109._12_4_;
        auVar47._16_4_ = auVar96._16_4_ * auVar109._16_4_;
        auVar47._20_4_ = auVar96._20_4_ * auVar109._20_4_;
        auVar47._24_4_ = auVar96._24_4_ * auVar109._24_4_;
        auVar47._28_4_ = auVar96._28_4_;
        auVar85 = vfmsub231ps_fma(auVar47,auVar106,auVar108);
        auVar48._4_4_ = auVar107._4_4_ * auVar106._4_4_;
        auVar48._0_4_ = auVar107._0_4_ * auVar106._0_4_;
        auVar48._8_4_ = auVar107._8_4_ * auVar106._8_4_;
        auVar48._12_4_ = auVar107._12_4_ * auVar106._12_4_;
        auVar48._16_4_ = auVar107._16_4_ * auVar106._16_4_;
        auVar48._20_4_ = auVar107._20_4_ * auVar106._20_4_;
        auVar48._24_4_ = auVar107._24_4_ * auVar106._24_4_;
        auVar48._28_4_ = auVar107._28_4_;
        auVar83 = vfmsub231ps_fma(auVar48,auVar109,auVar93);
        auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar83));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar95 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
        auVar190 = ZEXT3264(auVar95);
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        auVar24._16_4_ = 0x3f800000;
        auVar24._20_4_ = 0x3f800000;
        auVar24._24_4_ = 0x3f800000;
        auVar24._28_4_ = 0x3f800000;
        auVar93 = vfnmadd213ps_avx512vl(auVar95,ZEXT1632(auVar86),auVar24);
        auVar87 = vfmadd132ps_fma(auVar93,auVar95,auVar95);
        auVar187 = ZEXT1664(auVar87);
        auVar95 = vmulps_avx512vl(auVar114,ZEXT1632(auVar83));
        auVar85 = vfmadd231ps_fma(auVar95,auVar105,ZEXT1632(auVar85));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar94,ZEXT1632(auVar8));
        fVar146 = auVar87._0_4_;
        fVar156 = auVar87._4_4_;
        fVar81 = auVar87._8_4_;
        fVar82 = auVar87._12_4_;
        local_280 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar82,
                                       CONCAT48(auVar85._8_4_ * fVar81,
                                                CONCAT44(auVar85._4_4_ * fVar156,
                                                         auVar85._0_4_ * fVar146))));
        auVar203 = ZEXT3264(local_280);
        auVar149._8_4_ = 3;
        auVar149._0_8_ = 0x300000003;
        auVar149._12_4_ = 3;
        auVar149._16_4_ = 3;
        auVar149._20_4_ = 3;
        auVar149._24_4_ = 3;
        auVar149._28_4_ = 3;
        auVar95 = vpermps_avx2(auVar149,ZEXT1632((undefined1  [16])aVar5));
        uVar20 = vcmpps_avx512vl(auVar95,local_280,2);
        fVar167 = (ray->super_RayK<1>).tfar;
        auVar25._4_4_ = fVar167;
        auVar25._0_4_ = fVar167;
        auVar25._8_4_ = fVar167;
        auVar25._12_4_ = fVar167;
        auVar25._16_4_ = fVar167;
        auVar25._20_4_ = fVar167;
        auVar25._24_4_ = fVar167;
        auVar25._28_4_ = fVar167;
        uVar22 = vcmpps_avx512vl(local_280,auVar25,2);
        bVar80 = (byte)uVar20 & (byte)uVar22 & bVar80;
        if (bVar80 != 0) {
          uVar75 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar75 = bVar80 & uVar75;
          if ((char)uVar75 != '\0') {
            fVar167 = auVar97._0_4_ * fVar146;
            fVar135 = auVar97._4_4_ * fVar156;
            auVar49._4_4_ = fVar135;
            auVar49._0_4_ = fVar167;
            fVar136 = auVar97._8_4_ * fVar81;
            auVar49._8_4_ = fVar136;
            fVar139 = auVar97._12_4_ * fVar82;
            auVar49._12_4_ = fVar139;
            fVar159 = auVar97._16_4_ * 0.0;
            auVar49._16_4_ = fVar159;
            fVar142 = auVar97._20_4_ * 0.0;
            auVar49._20_4_ = fVar142;
            fVar143 = auVar97._24_4_ * 0.0;
            auVar49._24_4_ = fVar143;
            auVar49._28_4_ = auVar97._28_4_;
            auVar150._8_4_ = 0x3f800000;
            auVar150._0_8_ = 0x3f8000003f800000;
            auVar150._12_4_ = 0x3f800000;
            auVar150._16_4_ = 0x3f800000;
            auVar150._20_4_ = 0x3f800000;
            auVar150._24_4_ = 0x3f800000;
            auVar150._28_4_ = 0x3f800000;
            auVar95 = vsubps_avx(auVar150,auVar49);
            local_2c0._0_4_ =
                 (float)((uint)(bVar70 & 1) * (int)fVar167 |
                        (uint)!(bool)(bVar70 & 1) * auVar95._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar14 * (int)fVar135 | (uint)!bVar14 * auVar95._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar14 * (int)fVar136 | (uint)!bVar14 * auVar95._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar14 * (int)fVar139 | (uint)!bVar14 * auVar95._12_4_)
            ;
            bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar14 * (int)fVar159 | (uint)!bVar14 * auVar95._16_4_)
            ;
            bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar14 * (int)fVar142 | (uint)!bVar14 * auVar95._20_4_)
            ;
            bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar14 * (int)fVar143 | (uint)!bVar14 * auVar95._24_4_)
            ;
            bVar14 = SUB81(uVar71 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar95._28_4_);
            auVar95 = vsubps_avx(auVar102,auVar101);
            auVar87 = vfmadd213ps_fma(auVar95,local_2c0,auVar101);
            fVar167 = pre->depth_scale;
            auVar26._4_4_ = fVar167;
            auVar26._0_4_ = fVar167;
            auVar26._8_4_ = fVar167;
            auVar26._12_4_ = fVar167;
            auVar26._16_4_ = fVar167;
            auVar26._20_4_ = fVar167;
            auVar26._24_4_ = fVar167;
            auVar26._28_4_ = fVar167;
            auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                         CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                  CONCAT44(auVar87._4_4_ +
                                                                           auVar87._4_4_,
                                                                           auVar87._0_4_ +
                                                                           auVar87._0_4_)))),auVar26
                                     );
            uVar21 = vcmpps_avx512vl(local_280,auVar95,6);
            uVar75 = uVar75 & uVar21;
            bVar80 = (byte)uVar75;
            if (bVar80 != 0) {
              auVar165._0_4_ = auVar98._0_4_ * fVar146;
              auVar165._4_4_ = auVar98._4_4_ * fVar156;
              auVar165._8_4_ = auVar98._8_4_ * fVar81;
              auVar165._12_4_ = auVar98._12_4_ * fVar82;
              auVar165._16_4_ = auVar98._16_4_ * 0.0;
              auVar165._20_4_ = auVar98._20_4_ * 0.0;
              auVar165._24_4_ = auVar98._24_4_ * 0.0;
              auVar165._28_4_ = 0;
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar95 = vsubps_avx(auVar176,auVar165);
              auVar120._0_4_ =
                   (uint)(bVar70 & 1) * (int)auVar165._0_4_ |
                   (uint)!(bool)(bVar70 & 1) * auVar95._0_4_;
              bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
              auVar120._4_4_ = (uint)bVar14 * (int)auVar165._4_4_ | (uint)!bVar14 * auVar95._4_4_;
              bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
              auVar120._8_4_ = (uint)bVar14 * (int)auVar165._8_4_ | (uint)!bVar14 * auVar95._8_4_;
              bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
              auVar120._12_4_ = (uint)bVar14 * (int)auVar165._12_4_ | (uint)!bVar14 * auVar95._12_4_
              ;
              bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
              auVar120._16_4_ = (uint)bVar14 * (int)auVar165._16_4_ | (uint)!bVar14 * auVar95._16_4_
              ;
              bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
              auVar120._20_4_ = (uint)bVar14 * (int)auVar165._20_4_ | (uint)!bVar14 * auVar95._20_4_
              ;
              bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
              auVar120._24_4_ = (uint)bVar14 * (int)auVar165._24_4_ | (uint)!bVar14 * auVar95._24_4_
              ;
              auVar120._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar95._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar120,auVar176,auVar27);
              local_260 = 0;
              local_25c = iVar12;
              auVar194 = ZEXT1664(local_4b0);
              local_250 = local_4b0;
              auVar196 = ZEXT1664(local_4c0);
              local_240 = local_4c0;
              local_230 = *(undefined8 *)*pauVar3;
              uStack_228 = *(undefined8 *)(*pauVar3 + 8);
              if ((pGVar77->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar167 = 1.0 / auVar197._0_4_;
                local_200[0] = fVar167 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar167 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar167 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar167 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar167 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar167 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar167 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_280;
                auVar151._8_4_ = 0x7f800000;
                auVar151._0_8_ = 0x7f8000007f800000;
                auVar151._12_4_ = 0x7f800000;
                auVar151._16_4_ = 0x7f800000;
                auVar151._20_4_ = 0x7f800000;
                auVar151._24_4_ = 0x7f800000;
                auVar151._28_4_ = 0x7f800000;
                auVar95 = vblendmps_avx512vl(auVar151,local_280);
                auVar121._0_4_ =
                     (uint)(bVar80 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                bVar14 = (bool)((byte)(uVar75 >> 1) & 1);
                auVar121._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
                auVar121._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
                auVar121._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar75 >> 4) & 1);
                auVar121._16_4_ = (uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                auVar121._20_4_ = (uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar75 >> 6) & 1);
                auVar121._24_4_ = (uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = SUB81(uVar75 >> 7,0);
                auVar121._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * 0x7f800000;
                auVar95 = vshufps_avx(auVar121,auVar121,0xb1);
                auVar95 = vminps_avx(auVar121,auVar95);
                auVar93 = vshufpd_avx(auVar95,auVar95,5);
                auVar95 = vminps_avx(auVar95,auVar93);
                auVar93 = vpermpd_avx2(auVar95,0x4e);
                auVar95 = vminps_avx(auVar95,auVar93);
                uVar20 = vcmpps_avx512vl(auVar121,auVar95,0);
                uVar72 = (uint)uVar75;
                if ((bVar80 & (byte)uVar20) != 0) {
                  uVar72 = (uint)(bVar80 & (byte)uVar20);
                }
                uVar23 = 0;
                for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                  uVar23 = uVar23 + 1;
                }
                uVar71 = (ulong)uVar23;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_420 = local_280;
                  do {
                    local_494 = local_200[uVar71];
                    local_490 = *(undefined4 *)(local_1e0 + uVar71 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                    local_4f0.context = context->user;
                    fVar167 = 1.0 - local_494;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(local_494 * (fVar167 + fVar167))),
                                              ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                    auVar86 = ZEXT416((uint)local_494);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar86,
                                              ZEXT416(0xc0a00000));
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(local_494 * local_494 * 3.0)),
                                              ZEXT416((uint)(local_494 + local_494)),auVar87);
                    auVar190 = ZEXT1664(auVar85);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar86,
                                              ZEXT416(0x40000000));
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * -3.0)),
                                              ZEXT416((uint)(fVar167 + fVar167)),auVar87);
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_494 * local_494)),auVar86,
                                              ZEXT416((uint)(fVar167 * -2.0)));
                    fVar167 = auVar8._0_4_ * 0.5;
                    fVar146 = auVar85._0_4_ * 0.5;
                    auVar182 = ZEXT464((uint)fVar146);
                    fVar156 = auVar87._0_4_ * 0.5;
                    fVar81 = auVar86._0_4_ * 0.5;
                    auVar174._0_4_ = fVar81 * local_530;
                    auVar174._4_4_ = fVar81 * fStack_52c;
                    auVar174._8_4_ = fVar81 * fStack_528;
                    auVar174._12_4_ = fVar81 * fStack_524;
                    auVar186._4_4_ = fVar156;
                    auVar186._0_4_ = fVar156;
                    auVar186._8_4_ = fVar156;
                    auVar186._12_4_ = fVar156;
                    auVar69._8_8_ = uStack_518;
                    auVar69._0_8_ = local_520;
                    auVar87 = vfmadd132ps_fma(auVar186,auVar174,auVar69);
                    auVar187 = ZEXT1664(auVar87);
                    auVar175._4_4_ = fVar146;
                    auVar175._0_4_ = fVar146;
                    auVar175._8_4_ = fVar146;
                    auVar175._12_4_ = fVar146;
                    auVar86 = vfmadd213ps_fma(auVar175,auVar196._0_16_,auVar87);
                    auVar164._4_4_ = fVar167;
                    auVar164._0_4_ = fVar167;
                    auVar164._8_4_ = fVar167;
                    auVar164._12_4_ = fVar167;
                    auVar86 = vfmadd213ps_fma(auVar164,auVar194._0_16_,auVar86);
                    local_4a0 = vmovlps_avx(auVar86);
                    local_498 = vextractps_avx(auVar86,2);
                    local_48c = (int)local_538;
                    local_488 = (int)local_550;
                    local_484 = (local_4f0.context)->instID[0];
                    local_480 = (local_4f0.context)->instPrimID[0];
                    local_554 = -1;
                    local_4f0.valid = &local_554;
                    local_4f0.geometryUserPtr = pGVar77->userPtr;
                    local_4f0.ray = (RTCRayN *)ray;
                    local_4f0.hit = (RTCHitN *)&local_4a0;
                    local_4f0.N = 1;
                    if (pGVar77->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a4fd3e:
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar182 = ZEXT1664(auVar182._0_16_);
                        auVar187 = ZEXT1664(auVar187._0_16_);
                        auVar190 = ZEXT1664(auVar190._0_16_);
                        (*p_Var13)(&local_4f0);
                        auVar203 = ZEXT3264(local_420);
                        auVar196 = ZEXT1664(local_4c0);
                        auVar194 = ZEXT1664(local_4b0);
                        context = local_548;
                        ray = local_540;
                        if (*local_4f0.valid == 0) goto LAB_01a4fdec;
                      }
                      (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).components[0] =
                           *(float *)local_4f0.hit;
                      (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_4f0.hit + 4);
                      (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_4f0.hit + 8);
                      *(float *)((long)local_4f0.ray + 0x3c) = *(float *)(local_4f0.hit + 0xc);
                      *(float *)((long)local_4f0.ray + 0x40) = *(float *)(local_4f0.hit + 0x10);
                      *(float *)((long)local_4f0.ray + 0x44) = *(float *)(local_4f0.hit + 0x14);
                      *(float *)((long)local_4f0.ray + 0x48) = *(float *)(local_4f0.hit + 0x18);
                      *(float *)((long)local_4f0.ray + 0x4c) = *(float *)(local_4f0.hit + 0x1c);
                      *(float *)((long)local_4f0.ray + 0x50) = *(float *)(local_4f0.hit + 0x20);
                    }
                    else {
                      auVar182 = ZEXT464((uint)fVar146);
                      auVar187 = ZEXT1664(auVar87);
                      auVar190 = ZEXT1664(auVar85);
                      (*pGVar77->intersectionFilterN)(&local_4f0);
                      auVar203 = ZEXT3264(local_420);
                      auVar196 = ZEXT1664(local_4c0);
                      auVar194 = ZEXT1664(local_4b0);
                      context = local_548;
                      ray = local_540;
                      if (*local_4f0.valid != 0) goto LAB_01a4fd3e;
LAB_01a4fdec:
                      (local_540->super_RayK<1>).tfar = (float)local_400._0_4_;
                      context = local_548;
                      ray = local_540;
                    }
                    bVar80 = ~(byte)(1 << ((uint)uVar71 & 0x1f)) & (byte)uVar75;
                    fVar167 = (ray->super_RayK<1>).tfar;
                    auVar34._4_4_ = fVar167;
                    auVar34._0_4_ = fVar167;
                    auVar34._8_4_ = fVar167;
                    auVar34._12_4_ = fVar167;
                    auVar34._16_4_ = fVar167;
                    auVar34._20_4_ = fVar167;
                    auVar34._24_4_ = fVar167;
                    auVar34._28_4_ = fVar167;
                    uVar20 = vcmpps_avx512vl(auVar203._0_32_,auVar34,2);
                    pre = local_508;
                    prim = local_500;
                    if ((bVar80 & (byte)uVar20) == 0) goto LAB_01a4eedd;
                    local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar80 = bVar80 & (byte)uVar20;
                    uVar75 = (ulong)bVar80;
                    auVar155._8_4_ = 0x7f800000;
                    auVar155._0_8_ = 0x7f8000007f800000;
                    auVar155._12_4_ = 0x7f800000;
                    auVar155._16_4_ = 0x7f800000;
                    auVar155._20_4_ = 0x7f800000;
                    auVar155._24_4_ = 0x7f800000;
                    auVar155._28_4_ = 0x7f800000;
                    auVar95 = vblendmps_avx512vl(auVar155,auVar203._0_32_);
                    auVar134._0_4_ =
                         (uint)(bVar80 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000
                    ;
                    bVar14 = (bool)(bVar80 >> 1 & 1);
                    auVar134._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar80 >> 2 & 1);
                    auVar134._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar80 >> 3 & 1);
                    auVar134._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar80 >> 4 & 1);
                    auVar134._16_4_ = (uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar80 >> 5 & 1);
                    auVar134._20_4_ = (uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar80 >> 6 & 1);
                    auVar134._24_4_ = (uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar134._28_4_ =
                         (uint)(bVar80 >> 7) * auVar95._28_4_ |
                         (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                    auVar95 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar95 = vminps_avx(auVar134,auVar95);
                    auVar93 = vshufpd_avx(auVar95,auVar95,5);
                    auVar95 = vminps_avx(auVar95,auVar93);
                    auVar93 = vpermpd_avx2(auVar95,0x4e);
                    auVar95 = vminps_avx(auVar95,auVar93);
                    uVar20 = vcmpps_avx512vl(auVar134,auVar95,0);
                    bVar70 = (byte)uVar20 & bVar80;
                    if (bVar70 != 0) {
                      bVar80 = bVar70;
                    }
                    uVar73 = 0;
                    for (uVar74 = (uint)bVar80; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000
                        ) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar71 = (ulong)uVar73;
                  } while( true );
                }
                fVar167 = local_200[uVar71];
                fVar146 = *(float *)(local_1e0 + uVar71 * 4);
                fVar156 = 1.0 - fVar167;
                auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar167 * (fVar156 + fVar156))),
                                          ZEXT416((uint)fVar156),ZEXT416((uint)fVar156));
                auVar85 = ZEXT416((uint)fVar167);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,ZEXT416(0xc0a00000)
                                         );
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * 3.0)),
                                          ZEXT416((uint)(fVar167 + fVar167)),auVar87);
                auVar190 = ZEXT1664(auVar86);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,ZEXT416(0x40000000)
                                         );
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * -3.0)),
                                          ZEXT416((uint)(fVar156 + fVar156)),auVar87);
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),auVar85,
                                          ZEXT416((uint)(fVar156 * -2.0)));
                fVar156 = auVar8._0_4_ * 0.5;
                fVar81 = auVar86._0_4_ * 0.5;
                fVar82 = auVar87._0_4_ * 0.5;
                fVar135 = auVar85._0_4_ * 0.5;
                auVar168._0_4_ = fVar135 * local_530;
                auVar168._4_4_ = fVar135 * fStack_52c;
                auVar168._8_4_ = fVar135 * fStack_528;
                auVar168._12_4_ = fVar135 * fStack_524;
                auVar183._4_4_ = fVar82;
                auVar183._0_4_ = fVar82;
                auVar183._8_4_ = fVar82;
                auVar183._12_4_ = fVar82;
                auVar87 = vfmadd132ps_fma(auVar183,auVar168,*pauVar3);
                auVar187 = ZEXT1664(auVar87);
                auVar169._4_4_ = fVar81;
                auVar169._0_4_ = fVar81;
                auVar169._8_4_ = fVar81;
                auVar169._12_4_ = fVar81;
                auVar87 = vfmadd213ps_fma(auVar169,local_4c0,auVar87);
                auVar161._4_4_ = fVar156;
                auVar161._0_4_ = fVar156;
                auVar161._8_4_ = fVar156;
                auVar161._12_4_ = fVar156;
                auVar182 = ZEXT464((uint)*(float *)(local_1c0 + uVar71 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                auVar87 = vfmadd213ps_fma(auVar161,local_4b0,auVar87);
                uVar20 = vmovlps_avx(auVar87);
                *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                fVar156 = (float)vextractps_avx(auVar87,2);
                (ray->Ng).field_0.field_0.z = fVar156;
                ray->u = fVar167;
                ray->v = fVar146;
                ray->primID = uVar74;
                ray->geomID = uVar73;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pre = local_508;
                prim = local_500;
              }
            }
          }
        }
      }
    }
LAB_01a4eedd:
    if (8 < iVar12) {
      local_400 = vpbroadcastd_avx512vl();
      local_420._4_4_ = local_440._0_4_;
      local_420._0_4_ = local_440._0_4_;
      local_420._8_4_ = local_440._0_4_;
      local_420._12_4_ = local_440._0_4_;
      local_420._16_4_ = local_440._0_4_;
      local_420._20_4_ = local_440._0_4_;
      local_420._24_4_ = local_440._0_4_;
      local_420._28_4_ = local_440._0_4_;
      auVar152._8_4_ = 3;
      auVar152._0_8_ = 0x300000003;
      auVar152._12_4_ = 3;
      auVar152._16_4_ = 3;
      auVar152._20_4_ = 3;
      auVar152._24_4_ = 3;
      auVar152._28_4_ = 3;
      local_3e0 = vpermps_avx2(auVar152,local_3e0);
      local_120 = 1.0 / (float)local_460._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (lVar78 = 8; lVar78 < local_4f8; lVar78 = lVar78 + 8) {
        auVar95 = vpbroadcastd_avx512vl();
        auVar95 = vpor_avx2(auVar95,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar95,local_400,1);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar78 * 4 + lVar76);
        auVar93 = *(undefined1 (*) [32])(lVar76 + 0x22047f0 + lVar78 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar76 + 0x2204c74 + lVar78 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar76 + 0x22050f8 + lVar78 * 4);
        auVar203._0_4_ = auVar107._0_4_ * (float)local_3a0._0_4_;
        auVar203._4_4_ = auVar107._4_4_ * (float)local_3a0._4_4_;
        auVar203._8_4_ = auVar107._8_4_ * fStack_398;
        auVar203._12_4_ = auVar107._12_4_ * fStack_394;
        auVar203._16_4_ = auVar107._16_4_ * fStack_390;
        auVar203._20_4_ = auVar107._20_4_ * fStack_38c;
        auVar203._28_36_ = auVar187._28_36_;
        auVar203._24_4_ = auVar107._24_4_ * fStack_388;
        auVar187._0_4_ = auVar107._0_4_ * (float)local_3c0._0_4_;
        auVar187._4_4_ = auVar107._4_4_ * (float)local_3c0._4_4_;
        auVar187._8_4_ = auVar107._8_4_ * fStack_3b8;
        auVar187._12_4_ = auVar107._12_4_ * fStack_3b4;
        auVar187._16_4_ = auVar107._16_4_ * fStack_3b0;
        auVar187._20_4_ = auVar107._20_4_ * fStack_3ac;
        auVar187._28_36_ = auVar182._28_36_;
        auVar187._24_4_ = auVar107._24_4_ * fStack_3a8;
        auVar106 = vmulps_avx512vl(local_100,auVar107);
        auVar94 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar109,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar109,local_380);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar106,auVar93,local_c0);
        auVar87 = vfmadd231ps_fma(auVar94,auVar95,local_2e0);
        auVar187 = ZEXT1664(auVar87);
        auVar86 = vfmadd231ps_fma(auVar96,auVar95,local_300);
        auVar182 = ZEXT1664(auVar86);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar78 * 4 + lVar76);
        auVar94 = *(undefined1 (*) [32])(lVar76 + 0x2206c10 + lVar78 * 4);
        auVar98 = vfmadd231ps_avx512vl(auVar105,auVar95,local_a0);
        auVar96 = *(undefined1 (*) [32])(lVar76 + 0x2207094 + lVar78 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar76 + 0x2207518 + lVar78 * 4);
        auVar194._0_4_ = auVar105._0_4_ * (float)local_3a0._0_4_;
        auVar194._4_4_ = auVar105._4_4_ * (float)local_3a0._4_4_;
        auVar194._8_4_ = auVar105._8_4_ * fStack_398;
        auVar194._12_4_ = auVar105._12_4_ * fStack_394;
        auVar194._16_4_ = auVar105._16_4_ * fStack_390;
        auVar194._20_4_ = auVar105._20_4_ * fStack_38c;
        auVar194._28_36_ = auVar190._28_36_;
        auVar194._24_4_ = auVar105._24_4_ * fStack_388;
        auVar50._4_4_ = auVar105._4_4_ * (float)local_3c0._4_4_;
        auVar50._0_4_ = auVar105._0_4_ * (float)local_3c0._0_4_;
        auVar50._8_4_ = auVar105._8_4_ * fStack_3b8;
        auVar50._12_4_ = auVar105._12_4_ * fStack_3b4;
        auVar50._16_4_ = auVar105._16_4_ * fStack_3b0;
        auVar50._20_4_ = auVar105._20_4_ * fStack_3ac;
        auVar50._24_4_ = auVar105._24_4_ * fStack_3a8;
        auVar50._28_4_ = uStack_3a4;
        auVar108 = vmulps_avx512vl(local_100,auVar105);
        auVar97 = vfmadd231ps_avx512vl(auVar194._0_32_,auVar96,local_360);
        auVar92 = vfmadd231ps_avx512vl(auVar50,auVar96,local_380);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar96,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,local_340);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar94,local_c0);
        auVar85 = vfmadd231ps_fma(auVar97,auVar106,local_2e0);
        auVar190 = ZEXT1664(auVar85);
        auVar8 = vfmadd231ps_fma(auVar92,auVar106,local_300);
        auVar92 = vfmadd231ps_avx512vl(auVar108,auVar106,local_a0);
        auVar90 = vmaxps_avx512vl(auVar98,auVar92);
        auVar108 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar87));
        auVar97 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar86));
        auVar91 = vmulps_avx512vl(ZEXT1632(auVar86),auVar108);
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar87),auVar97);
        auVar91 = vsubps_avx512vl(auVar91,auVar99);
        auVar99 = vmulps_avx512vl(auVar97,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,auVar108);
        auVar90 = vmulps_avx512vl(auVar90,auVar90);
        auVar90 = vmulps_avx512vl(auVar90,auVar99);
        auVar91 = vmulps_avx512vl(auVar91,auVar91);
        uVar20 = vcmpps_avx512vl(auVar91,auVar90,2);
        bVar80 = (byte)uVar22 & (byte)uVar20;
        if (bVar80 != 0) {
          auVar105 = vmulps_avx512vl(local_1a0,auVar105);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_180,auVar105);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_160,auVar96);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_140,auVar94);
          auVar107 = vmulps_avx512vl(local_1a0,auVar107);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_180,auVar107);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_160,auVar109);
          auVar94 = vfmadd213ps_avx512vl(auVar95,local_140,auVar93);
          auVar95 = *(undefined1 (*) [32])(lVar76 + 0x220557c + lVar78 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar76 + 0x2205a00 + lVar78 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar76 + 0x2205e84 + lVar78 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar76 + 0x2206308 + lVar78 * 4);
          auVar96 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar105 = vmulps_avx512vl(_local_3c0,auVar107);
          auVar107 = vmulps_avx512vl(local_1a0,auVar107);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_360);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_380);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_180,auVar109);
          auVar107 = vfmadd231ps_avx512vl(auVar96,auVar93,local_320);
          auVar96 = vfmadd231ps_avx512vl(auVar105,auVar93,local_340);
          auVar93 = vfmadd231ps_avx512vl(auVar109,local_160,auVar93);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,local_2e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,local_300);
          auVar105 = vfmadd231ps_avx512vl(auVar93,local_140,auVar95);
          auVar95 = *(undefined1 (*) [32])(lVar76 + 0x220799c + lVar78 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar76 + 0x22082a4 + lVar78 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar76 + 0x2208728 + lVar78 * 4);
          auVar90 = vmulps_avx512vl(_local_3a0,auVar109);
          auVar91 = vmulps_avx512vl(_local_3c0,auVar109);
          auVar109 = vmulps_avx512vl(local_1a0,auVar109);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,local_360);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_380);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_180,auVar93);
          auVar93 = *(undefined1 (*) [32])(lVar76 + 0x2207e20 + lVar78 * 4);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,local_320);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_340);
          auVar93 = vfmadd231ps_avx512vl(auVar109,local_160,auVar93);
          auVar109 = vfmadd231ps_avx512vl(auVar90,auVar95,local_2e0);
          auVar90 = vfmadd231ps_avx512vl(auVar91,auVar95,local_300);
          auVar93 = vfmadd231ps_avx512vl(auVar93,local_140,auVar95);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar107,auVar91);
          vandps_avx512vl(auVar96,auVar91);
          auVar95 = vmaxps_avx(auVar91,auVar91);
          vandps_avx512vl(auVar105,auVar91);
          auVar95 = vmaxps_avx(auVar95,auVar91);
          uVar71 = vcmpps_avx512vl(auVar95,local_420,1);
          bVar14 = (bool)((byte)uVar71 & 1);
          auVar122._0_4_ = (float)((uint)bVar14 * auVar108._0_4_ | (uint)!bVar14 * auVar107._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar107._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar107._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar107._12_4_);
          bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * auVar107._16_4_);
          bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * auVar107._20_4_);
          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * auVar107._24_4_);
          bVar14 = SUB81(uVar71 >> 7,0);
          auVar122._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * auVar107._28_4_;
          bVar14 = (bool)((byte)uVar71 & 1);
          auVar123._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar96._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar96._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar96._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar96._12_4_);
          bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar96._16_4_);
          bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar96._20_4_);
          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar96._24_4_);
          bVar14 = SUB81(uVar71 >> 7,0);
          auVar123._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar96._28_4_;
          vandps_avx512vl(auVar109,auVar91);
          vandps_avx512vl(auVar90,auVar91);
          auVar95 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar93,auVar91);
          auVar95 = vmaxps_avx(auVar95,auVar123);
          uVar71 = vcmpps_avx512vl(auVar95,local_420,1);
          bVar14 = (bool)((byte)uVar71 & 1);
          auVar124._0_4_ = (uint)bVar14 * auVar108._0_4_ | (uint)!bVar14 * auVar109._0_4_;
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar109._4_4_;
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar109._8_4_;
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar109._12_4_;
          bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * auVar109._16_4_;
          bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * auVar109._20_4_;
          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * auVar109._24_4_;
          bVar14 = SUB81(uVar71 >> 7,0);
          auVar124._28_4_ = (uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * auVar109._28_4_;
          bVar14 = (bool)((byte)uVar71 & 1);
          auVar125._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar90._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar90._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar90._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar90._12_4_);
          bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar125._16_4_ = (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar90._16_4_);
          bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar125._20_4_ = (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar90._20_4_);
          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar125._24_4_ = (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar90._24_4_);
          bVar14 = SUB81(uVar71 >> 7,0);
          auVar125._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar90._28_4_;
          auVar193._8_4_ = 0x80000000;
          auVar193._0_8_ = 0x8000000080000000;
          auVar193._12_4_ = 0x80000000;
          auVar193._16_4_ = 0x80000000;
          auVar193._20_4_ = 0x80000000;
          auVar193._24_4_ = 0x80000000;
          auVar193._28_4_ = 0x80000000;
          auVar95 = vxorps_avx512vl(auVar124,auVar193);
          auVar89 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
          auVar93 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar89));
          auVar83 = vfmadd231ps_fma(auVar93,auVar123,auVar123);
          auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
          auVar206._8_4_ = 0xbf000000;
          auVar206._0_8_ = 0xbf000000bf000000;
          auVar206._12_4_ = 0xbf000000;
          auVar206._16_4_ = 0xbf000000;
          auVar206._20_4_ = 0xbf000000;
          auVar206._24_4_ = 0xbf000000;
          auVar206._28_4_ = 0xbf000000;
          fVar167 = auVar93._0_4_;
          fVar146 = auVar93._4_4_;
          fVar156 = auVar93._8_4_;
          fVar81 = auVar93._12_4_;
          fVar82 = auVar93._16_4_;
          fVar135 = auVar93._20_4_;
          fVar136 = auVar93._24_4_;
          auVar51._4_4_ = fVar146 * fVar146 * fVar146 * auVar83._4_4_ * -0.5;
          auVar51._0_4_ = fVar167 * fVar167 * fVar167 * auVar83._0_4_ * -0.5;
          auVar51._8_4_ = fVar156 * fVar156 * fVar156 * auVar83._8_4_ * -0.5;
          auVar51._12_4_ = fVar81 * fVar81 * fVar81 * auVar83._12_4_ * -0.5;
          auVar51._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
          auVar51._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
          auVar51._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
          auVar51._28_4_ = auVar123._28_4_;
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar93 = vfmadd231ps_avx512vl(auVar51,auVar109,auVar93);
          auVar52._4_4_ = auVar123._4_4_ * auVar93._4_4_;
          auVar52._0_4_ = auVar123._0_4_ * auVar93._0_4_;
          auVar52._8_4_ = auVar123._8_4_ * auVar93._8_4_;
          auVar52._12_4_ = auVar123._12_4_ * auVar93._12_4_;
          auVar52._16_4_ = auVar123._16_4_ * auVar93._16_4_;
          auVar52._20_4_ = auVar123._20_4_ * auVar93._20_4_;
          auVar52._24_4_ = auVar123._24_4_ * auVar93._24_4_;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = auVar93._4_4_ * -auVar122._4_4_;
          auVar53._0_4_ = auVar93._0_4_ * -auVar122._0_4_;
          auVar53._8_4_ = auVar93._8_4_ * -auVar122._8_4_;
          auVar53._12_4_ = auVar93._12_4_ * -auVar122._12_4_;
          auVar53._16_4_ = auVar93._16_4_ * -auVar122._16_4_;
          auVar53._20_4_ = auVar93._20_4_ * -auVar122._20_4_;
          auVar53._24_4_ = auVar93._24_4_ * -auVar122._24_4_;
          auVar53._28_4_ = auVar123._28_4_;
          auVar107 = vmulps_avx512vl(auVar93,ZEXT1632(auVar89));
          auVar105 = ZEXT1632(auVar89);
          auVar93 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar105);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar125,auVar125);
          auVar96 = vrsqrt14ps_avx512vl(auVar93);
          auVar93 = vmulps_avx512vl(auVar93,auVar206);
          fVar167 = auVar96._0_4_;
          fVar146 = auVar96._4_4_;
          fVar156 = auVar96._8_4_;
          fVar81 = auVar96._12_4_;
          fVar82 = auVar96._16_4_;
          fVar135 = auVar96._20_4_;
          fVar136 = auVar96._24_4_;
          auVar54._4_4_ = fVar146 * fVar146 * fVar146 * auVar93._4_4_;
          auVar54._0_4_ = fVar167 * fVar167 * fVar167 * auVar93._0_4_;
          auVar54._8_4_ = fVar156 * fVar156 * fVar156 * auVar93._8_4_;
          auVar54._12_4_ = fVar81 * fVar81 * fVar81 * auVar93._12_4_;
          auVar54._16_4_ = fVar82 * fVar82 * fVar82 * auVar93._16_4_;
          auVar54._20_4_ = fVar135 * fVar135 * fVar135 * auVar93._20_4_;
          auVar54._24_4_ = fVar136 * fVar136 * fVar136 * auVar93._24_4_;
          auVar54._28_4_ = auVar93._28_4_;
          auVar93 = vfmadd231ps_avx512vl(auVar54,auVar109,auVar96);
          auVar55._4_4_ = auVar125._4_4_ * auVar93._4_4_;
          auVar55._0_4_ = auVar125._0_4_ * auVar93._0_4_;
          auVar55._8_4_ = auVar125._8_4_ * auVar93._8_4_;
          auVar55._12_4_ = auVar125._12_4_ * auVar93._12_4_;
          auVar55._16_4_ = auVar125._16_4_ * auVar93._16_4_;
          auVar55._20_4_ = auVar125._20_4_ * auVar93._20_4_;
          auVar55._24_4_ = auVar125._24_4_ * auVar93._24_4_;
          auVar55._28_4_ = auVar96._28_4_;
          auVar56._4_4_ = auVar93._4_4_ * auVar95._4_4_;
          auVar56._0_4_ = auVar93._0_4_ * auVar95._0_4_;
          auVar56._8_4_ = auVar93._8_4_ * auVar95._8_4_;
          auVar56._12_4_ = auVar93._12_4_ * auVar95._12_4_;
          auVar56._16_4_ = auVar93._16_4_ * auVar95._16_4_;
          auVar56._20_4_ = auVar93._20_4_ * auVar95._20_4_;
          auVar56._24_4_ = auVar93._24_4_ * auVar95._24_4_;
          auVar56._28_4_ = auVar95._28_4_;
          auVar95 = vmulps_avx512vl(auVar93,auVar105);
          auVar83 = vfmadd213ps_fma(auVar52,auVar98,ZEXT1632(auVar87));
          auVar9 = vfmadd213ps_fma(auVar53,auVar98,ZEXT1632(auVar86));
          auVar109 = vfmadd213ps_avx512vl(auVar107,auVar98,auVar94);
          auVar96 = vfmadd213ps_avx512vl(auVar55,auVar92,ZEXT1632(auVar85));
          auVar11 = vfnmadd213ps_fma(auVar52,auVar98,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar56,auVar92,ZEXT1632(auVar8));
          auVar84 = vfnmadd213ps_fma(auVar53,auVar98,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar95,auVar92,auVar106);
          auVar160 = vfnmadd231ps_fma(auVar94,auVar98,auVar107);
          auVar88 = vfnmadd213ps_fma(auVar55,auVar92,ZEXT1632(auVar85));
          auVar157 = vfnmadd213ps_fma(auVar56,auVar92,ZEXT1632(auVar8));
          auVar188 = vfnmadd231ps_fma(auVar106,auVar92,auVar95);
          auVar106 = vsubps_avx512vl(auVar96,ZEXT1632(auVar11));
          auVar95 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar84));
          auVar93 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar160));
          auVar57._4_4_ = auVar95._4_4_ * auVar160._4_4_;
          auVar57._0_4_ = auVar95._0_4_ * auVar160._0_4_;
          auVar57._8_4_ = auVar95._8_4_ * auVar160._8_4_;
          auVar57._12_4_ = auVar95._12_4_ * auVar160._12_4_;
          auVar57._16_4_ = auVar95._16_4_ * 0.0;
          auVar57._20_4_ = auVar95._20_4_ * 0.0;
          auVar57._24_4_ = auVar95._24_4_ * 0.0;
          auVar57._28_4_ = auVar107._28_4_;
          auVar85 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar84),auVar93);
          auVar58._4_4_ = auVar93._4_4_ * auVar11._4_4_;
          auVar58._0_4_ = auVar93._0_4_ * auVar11._0_4_;
          auVar58._8_4_ = auVar93._8_4_ * auVar11._8_4_;
          auVar58._12_4_ = auVar93._12_4_ * auVar11._12_4_;
          auVar58._16_4_ = auVar93._16_4_ * 0.0;
          auVar58._20_4_ = auVar93._20_4_ * 0.0;
          auVar58._24_4_ = auVar93._24_4_ * 0.0;
          auVar58._28_4_ = auVar93._28_4_;
          auVar8 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar160),auVar106);
          auVar59._4_4_ = auVar84._4_4_ * auVar106._4_4_;
          auVar59._0_4_ = auVar84._0_4_ * auVar106._0_4_;
          auVar59._8_4_ = auVar84._8_4_ * auVar106._8_4_;
          auVar59._12_4_ = auVar84._12_4_ * auVar106._12_4_;
          auVar59._16_4_ = auVar106._16_4_ * 0.0;
          auVar59._20_4_ = auVar106._20_4_ * 0.0;
          auVar59._24_4_ = auVar106._24_4_ * 0.0;
          auVar59._28_4_ = auVar106._28_4_;
          auVar10 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar11),auVar95);
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar105,ZEXT1632(auVar8));
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar105,ZEXT1632(auVar85));
          auVar91 = ZEXT1632(auVar89);
          uVar71 = vcmpps_avx512vl(auVar95,auVar91,2);
          bVar70 = (byte)uVar71;
          fVar142 = (float)((uint)(bVar70 & 1) * auVar83._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar88._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          fVar137 = (float)((uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar88._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          fVar140 = (float)((uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar88._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          fVar144 = (float)((uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar88._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar140,CONCAT44(fVar137,fVar142))));
          fVar143 = (float)((uint)(bVar70 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar157._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          fVar138 = (float)((uint)bVar14 * auVar9._4_4_ | (uint)!bVar14 * auVar157._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          fVar141 = (float)((uint)bVar14 * auVar9._8_4_ | (uint)!bVar14 * auVar157._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          fVar145 = (float)((uint)bVar14 * auVar9._12_4_ | (uint)!bVar14 * auVar157._12_4_);
          auVar108 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar141,CONCAT44(fVar138,fVar143))));
          auVar126._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar188._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar188._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar188._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar126._12_4_ =
               (float)((uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar188._12_4_);
          fVar167 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar109._16_4_);
          auVar126._16_4_ = fVar167;
          fVar156 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar109._20_4_);
          auVar126._20_4_ = fVar156;
          fVar146 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar109._24_4_);
          auVar126._24_4_ = fVar146;
          iVar1 = (uint)(byte)(uVar71 >> 7) * auVar109._28_4_;
          auVar126._28_4_ = iVar1;
          auVar95 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar96);
          auVar127._0_4_ =
               (uint)(bVar70 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar85._0_4_;
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar85._4_4_;
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar85._8_4_;
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar85._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar95._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar95._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar95._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar95._28_4_;
          auVar95 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar87));
          auVar128._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar83._0_4_);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar83._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar83._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar83._12_4_);
          fVar135 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar95._16_4_);
          auVar128._16_4_ = fVar135;
          fVar82 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar95._20_4_);
          auVar128._20_4_ = fVar82;
          fVar81 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar95._24_4_);
          auVar128._24_4_ = fVar81;
          auVar128._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar95._28_4_;
          auVar95 = vblendmps_avx512vl(ZEXT1632(auVar160),ZEXT1632(auVar86));
          auVar129._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar9._0_4_
                      );
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar9._4_4_);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar9._8_4_);
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar9._12_4_);
          fVar159 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar95._16_4_);
          auVar129._16_4_ = fVar159;
          fVar139 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar95._20_4_);
          auVar129._20_4_ = fVar139;
          fVar136 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar95._24_4_);
          auVar129._24_4_ = fVar136;
          iVar2 = (uint)(byte)(uVar71 >> 7) * auVar95._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar70 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar96._0_4_;
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar14 * (int)auVar11._4_4_ | (uint)!bVar14 * auVar96._4_4_;
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar14 * (int)auVar11._8_4_ | (uint)!bVar14 * auVar96._8_4_;
          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar14 * (int)auVar11._12_4_ | (uint)!bVar14 * auVar96._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar96._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar96._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar96._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar96._28_4_;
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar96 = vsubps_avx512vl(auVar130,auVar105);
          auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar84._12_4_ |
                                                  (uint)!bVar18 * auVar87._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar84._8_4_ |
                                                           (uint)!bVar16 * auVar87._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar84._4_4_ |
                                                                    (uint)!bVar14 * auVar87._4_4_,
                                                                    (uint)(bVar70 & 1) *
                                                                    (int)auVar84._0_4_ |
                                                                    (uint)!(bool)(bVar70 & 1) *
                                                                    auVar87._0_4_)))),auVar108);
          auVar187 = ZEXT3264(auVar93);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar160._12_4_ |
                                                   (uint)!bVar19 * auVar86._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar160._8_4_ |
                                                            (uint)!bVar17 * auVar86._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar160._4_4_ |
                                                                     (uint)!bVar15 * auVar86._4_4_,
                                                                     (uint)(bVar70 & 1) *
                                                                     (int)auVar160._0_4_ |
                                                                     (uint)!(bool)(bVar70 & 1) *
                                                                     auVar86._0_4_)))),auVar126);
          auVar107 = vsubps_avx(auVar105,auVar127);
          auVar190 = ZEXT3264(auVar107);
          auVar106 = vsubps_avx(auVar108,auVar128);
          auVar94 = vsubps_avx(auVar126,auVar129);
          auVar60._4_4_ = auVar109._4_4_ * fVar137;
          auVar60._0_4_ = auVar109._0_4_ * fVar142;
          auVar60._8_4_ = auVar109._8_4_ * fVar140;
          auVar60._12_4_ = auVar109._12_4_ * fVar144;
          auVar60._16_4_ = auVar109._16_4_ * 0.0;
          auVar60._20_4_ = auVar109._20_4_ * 0.0;
          auVar60._24_4_ = auVar109._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar60,auVar126,auVar96);
          auVar177._0_4_ = fVar143 * auVar96._0_4_;
          auVar177._4_4_ = fVar138 * auVar96._4_4_;
          auVar177._8_4_ = fVar141 * auVar96._8_4_;
          auVar177._12_4_ = fVar145 * auVar96._12_4_;
          auVar177._16_4_ = auVar96._16_4_ * 0.0;
          auVar177._20_4_ = auVar96._20_4_ * 0.0;
          auVar177._24_4_ = auVar96._24_4_ * 0.0;
          auVar177._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar177,auVar105,auVar93);
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar91,ZEXT1632(auVar87));
          auVar180._0_4_ = auVar93._0_4_ * auVar126._0_4_;
          auVar180._4_4_ = auVar93._4_4_ * auVar126._4_4_;
          auVar180._8_4_ = auVar93._8_4_ * auVar126._8_4_;
          auVar180._12_4_ = auVar93._12_4_ * auVar126._12_4_;
          auVar180._16_4_ = auVar93._16_4_ * fVar167;
          auVar180._20_4_ = auVar93._20_4_ * fVar156;
          auVar180._24_4_ = auVar93._24_4_ * fVar146;
          auVar180._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar180,auVar108,auVar109);
          auVar97 = vfmadd231ps_avx512vl(auVar95,auVar91,ZEXT1632(auVar87));
          auVar95 = vmulps_avx512vl(auVar94,auVar127);
          auVar95 = vfmsub231ps_avx512vl(auVar95,auVar107,auVar129);
          auVar61._4_4_ = auVar106._4_4_ * auVar129._4_4_;
          auVar61._0_4_ = auVar106._0_4_ * auVar129._0_4_;
          auVar61._8_4_ = auVar106._8_4_ * auVar129._8_4_;
          auVar61._12_4_ = auVar106._12_4_ * auVar129._12_4_;
          auVar61._16_4_ = auVar106._16_4_ * fVar159;
          auVar61._20_4_ = auVar106._20_4_ * fVar139;
          auVar61._24_4_ = auVar106._24_4_ * fVar136;
          auVar61._28_4_ = iVar2;
          auVar87 = vfmsub231ps_fma(auVar61,auVar128,auVar94);
          auVar181._0_4_ = auVar128._0_4_ * auVar107._0_4_;
          auVar181._4_4_ = auVar128._4_4_ * auVar107._4_4_;
          auVar181._8_4_ = auVar128._8_4_ * auVar107._8_4_;
          auVar181._12_4_ = auVar128._12_4_ * auVar107._12_4_;
          auVar181._16_4_ = fVar135 * auVar107._16_4_;
          auVar181._20_4_ = fVar82 * auVar107._20_4_;
          auVar181._24_4_ = fVar81 * auVar107._24_4_;
          auVar181._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar181,auVar106,auVar127);
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar91,auVar95);
          auVar90 = vfmadd231ps_avx512vl(auVar95,auVar91,ZEXT1632(auVar87));
          auVar182 = ZEXT3264(auVar90);
          auVar95 = vmaxps_avx(auVar97,auVar90);
          uVar20 = vcmpps_avx512vl(auVar95,auVar91,2);
          bVar80 = bVar80 & (byte)uVar20;
          if (bVar80 != 0) {
            auVar62._4_4_ = auVar94._4_4_ * auVar93._4_4_;
            auVar62._0_4_ = auVar94._0_4_ * auVar93._0_4_;
            auVar62._8_4_ = auVar94._8_4_ * auVar93._8_4_;
            auVar62._12_4_ = auVar94._12_4_ * auVar93._12_4_;
            auVar62._16_4_ = auVar94._16_4_ * auVar93._16_4_;
            auVar62._20_4_ = auVar94._20_4_ * auVar93._20_4_;
            auVar62._24_4_ = auVar94._24_4_ * auVar93._24_4_;
            auVar62._28_4_ = auVar95._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,auVar106,auVar109);
            auVar63._4_4_ = auVar109._4_4_ * auVar107._4_4_;
            auVar63._0_4_ = auVar109._0_4_ * auVar107._0_4_;
            auVar63._8_4_ = auVar109._8_4_ * auVar107._8_4_;
            auVar63._12_4_ = auVar109._12_4_ * auVar107._12_4_;
            auVar63._16_4_ = auVar109._16_4_ * auVar107._16_4_;
            auVar63._20_4_ = auVar109._20_4_ * auVar107._20_4_;
            auVar63._24_4_ = auVar109._24_4_ * auVar107._24_4_;
            auVar63._28_4_ = auVar109._28_4_;
            auVar85 = vfmsub231ps_fma(auVar63,auVar96,auVar94);
            auVar64._4_4_ = auVar106._4_4_ * auVar96._4_4_;
            auVar64._0_4_ = auVar106._0_4_ * auVar96._0_4_;
            auVar64._8_4_ = auVar106._8_4_ * auVar96._8_4_;
            auVar64._12_4_ = auVar106._12_4_ * auVar96._12_4_;
            auVar64._16_4_ = auVar106._16_4_ * auVar96._16_4_;
            auVar64._20_4_ = auVar106._20_4_ * auVar96._20_4_;
            auVar64._24_4_ = auVar106._24_4_ * auVar96._24_4_;
            auVar64._28_4_ = auVar106._28_4_;
            auVar83 = vfmsub231ps_fma(auVar64,auVar107,auVar93);
            auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar83));
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar95 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
            auVar190 = ZEXT3264(auVar95);
            auVar29._8_4_ = 0x3f800000;
            auVar29._0_8_ = 0x3f8000003f800000;
            auVar29._12_4_ = 0x3f800000;
            auVar29._16_4_ = 0x3f800000;
            auVar29._20_4_ = 0x3f800000;
            auVar29._24_4_ = 0x3f800000;
            auVar29._28_4_ = 0x3f800000;
            auVar93 = vfnmadd213ps_avx512vl(auVar95,ZEXT1632(auVar86),auVar29);
            auVar87 = vfmadd132ps_fma(auVar93,auVar95,auVar95);
            auVar187 = ZEXT1664(auVar87);
            auVar65._4_4_ = auVar83._4_4_ * auVar126._4_4_;
            auVar65._0_4_ = auVar83._0_4_ * auVar126._0_4_;
            auVar65._8_4_ = auVar83._8_4_ * auVar126._8_4_;
            auVar65._12_4_ = auVar83._12_4_ * auVar126._12_4_;
            auVar65._16_4_ = fVar167 * 0.0;
            auVar65._20_4_ = fVar156 * 0.0;
            auVar65._24_4_ = fVar146 * 0.0;
            auVar65._28_4_ = iVar1;
            auVar85 = vfmadd231ps_fma(auVar65,auVar108,ZEXT1632(auVar85));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,ZEXT1632(auVar8));
            fVar146 = auVar87._0_4_;
            fVar156 = auVar87._4_4_;
            fVar81 = auVar87._8_4_;
            fVar82 = auVar87._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar82,
                                           CONCAT48(auVar85._8_4_ * fVar81,
                                                    CONCAT44(auVar85._4_4_ * fVar156,
                                                             auVar85._0_4_ * fVar146))));
            auVar203 = ZEXT3264(local_280);
            uVar20 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar167 = (ray->super_RayK<1>).tfar;
            auVar30._4_4_ = fVar167;
            auVar30._0_4_ = fVar167;
            auVar30._8_4_ = fVar167;
            auVar30._12_4_ = fVar167;
            auVar30._16_4_ = fVar167;
            auVar30._20_4_ = fVar167;
            auVar30._24_4_ = fVar167;
            auVar30._28_4_ = fVar167;
            uVar22 = vcmpps_avx512vl(local_280,auVar30,2);
            bVar80 = (byte)uVar20 & (byte)uVar22 & bVar80;
            if (bVar80 != 0) {
              uVar75 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar75 = bVar80 & uVar75;
              if ((char)uVar75 != '\0') {
                fVar167 = auVar97._0_4_ * fVar146;
                fVar135 = auVar97._4_4_ * fVar156;
                auVar66._4_4_ = fVar135;
                auVar66._0_4_ = fVar167;
                fVar136 = auVar97._8_4_ * fVar81;
                auVar66._8_4_ = fVar136;
                fVar139 = auVar97._12_4_ * fVar82;
                auVar66._12_4_ = fVar139;
                fVar159 = auVar97._16_4_ * 0.0;
                auVar66._16_4_ = fVar159;
                fVar142 = auVar97._20_4_ * 0.0;
                auVar66._20_4_ = fVar142;
                fVar143 = auVar97._24_4_ * 0.0;
                auVar66._24_4_ = fVar143;
                auVar66._28_4_ = auVar97._28_4_;
                auVar166._8_4_ = 0x3f800000;
                auVar166._0_8_ = 0x3f8000003f800000;
                auVar166._12_4_ = 0x3f800000;
                auVar166._16_4_ = 0x3f800000;
                auVar166._20_4_ = 0x3f800000;
                auVar166._24_4_ = 0x3f800000;
                auVar166._28_4_ = 0x3f800000;
                auVar95 = vsubps_avx(auVar166,auVar66);
                local_2c0._0_4_ =
                     (float)((uint)(bVar70 & 1) * (int)fVar167 |
                            (uint)!(bool)(bVar70 & 1) * auVar95._0_4_);
                bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar14 * (int)fVar135 | (uint)!bVar14 * auVar95._4_4_);
                bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar14 * (int)fVar136 | (uint)!bVar14 * auVar95._8_4_);
                bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar14 * (int)fVar139 | (uint)!bVar14 * auVar95._12_4_);
                bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar14 * (int)fVar159 | (uint)!bVar14 * auVar95._16_4_);
                bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar14 * (int)fVar142 | (uint)!bVar14 * auVar95._20_4_);
                bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar14 * (int)fVar143 | (uint)!bVar14 * auVar95._24_4_);
                bVar14 = SUB81(uVar71 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar95._28_4_);
                auVar95 = vsubps_avx(auVar92,auVar98);
                auVar87 = vfmadd213ps_fma(auVar95,local_2c0,auVar98);
                fVar167 = pre->depth_scale;
                auVar31._4_4_ = fVar167;
                auVar31._0_4_ = fVar167;
                auVar31._8_4_ = fVar167;
                auVar31._12_4_ = fVar167;
                auVar31._16_4_ = fVar167;
                auVar31._20_4_ = fVar167;
                auVar31._24_4_ = fVar167;
                auVar31._28_4_ = fVar167;
                auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                             CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                      CONCAT44(auVar87._4_4_ +
                                                                               auVar87._4_4_,
                                                                               auVar87._0_4_ +
                                                                               auVar87._0_4_)))),
                                          auVar31);
                uVar21 = vcmpps_avx512vl(local_280,auVar95,6);
                uVar75 = uVar75 & uVar21;
                bVar80 = (byte)uVar75;
                if (bVar80 != 0) {
                  auVar158._0_4_ = auVar90._0_4_ * fVar146;
                  auVar158._4_4_ = auVar90._4_4_ * fVar156;
                  auVar158._8_4_ = auVar90._8_4_ * fVar81;
                  auVar158._12_4_ = auVar90._12_4_ * fVar82;
                  auVar158._16_4_ = auVar90._16_4_ * 0.0;
                  auVar158._20_4_ = auVar90._20_4_ * 0.0;
                  auVar158._24_4_ = auVar90._24_4_ * 0.0;
                  auVar158._28_4_ = 0;
                  auVar178._8_4_ = 0x3f800000;
                  auVar178._0_8_ = 0x3f8000003f800000;
                  auVar178._12_4_ = 0x3f800000;
                  auVar178._16_4_ = 0x3f800000;
                  auVar178._20_4_ = 0x3f800000;
                  auVar178._24_4_ = 0x3f800000;
                  auVar178._28_4_ = 0x3f800000;
                  auVar95 = vsubps_avx(auVar178,auVar158);
                  auVar131._0_4_ =
                       (uint)(bVar70 & 1) * (int)auVar158._0_4_ |
                       (uint)!(bool)(bVar70 & 1) * auVar95._0_4_;
                  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar14 * (int)auVar158._4_4_ | (uint)!bVar14 * auVar95._4_4_;
                  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar14 * (int)auVar158._8_4_ | (uint)!bVar14 * auVar95._8_4_;
                  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar14 * (int)auVar158._12_4_ | (uint)!bVar14 * auVar95._12_4_;
                  bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar14 * (int)auVar158._16_4_ | (uint)!bVar14 * auVar95._16_4_;
                  bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar14 * (int)auVar158._20_4_ | (uint)!bVar14 * auVar95._20_4_;
                  bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar14 * (int)auVar158._24_4_ | (uint)!bVar14 * auVar95._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar95._28_4_;
                  auVar32._8_4_ = 0x40000000;
                  auVar32._0_8_ = 0x4000000040000000;
                  auVar32._12_4_ = 0x40000000;
                  auVar32._16_4_ = 0x40000000;
                  auVar32._20_4_ = 0x40000000;
                  auVar32._24_4_ = 0x40000000;
                  auVar32._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar131,auVar178,auVar32);
                  local_260 = (int)lVar78;
                  local_25c = iVar12;
                  auVar194 = ZEXT1664(local_4b0);
                  local_250 = local_4b0;
                  auVar196 = ZEXT1664(local_4c0);
                  local_240 = local_4c0;
                  local_230 = local_520;
                  uStack_228 = uStack_518;
                  local_220 = CONCAT44(fStack_52c,local_530);
                  uStack_218 = CONCAT44(fStack_524,fStack_528);
                  pGVar77 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar77->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar87 = vcvtsi2ss_avx512f(auVar89,(int)lVar78);
                    fVar167 = auVar87._0_4_;
                    local_200[0] = (fVar167 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar167 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar167 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar167 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar167 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar167 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar167 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar167 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar95 = vblendmps_avx512vl(auVar153,local_280);
                    auVar132._0_4_ =
                         (uint)(bVar80 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000
                    ;
                    bVar14 = (bool)((byte)(uVar75 >> 1) & 1);
                    auVar132._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
                    auVar132._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
                    auVar132._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar75 >> 4) & 1);
                    auVar132._16_4_ = (uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                    auVar132._20_4_ = (uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar75 >> 6) & 1);
                    auVar132._24_4_ = (uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar75 >> 7,0);
                    auVar132._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar95 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar95 = vminps_avx(auVar132,auVar95);
                    auVar93 = vshufpd_avx(auVar95,auVar95,5);
                    auVar95 = vminps_avx(auVar95,auVar93);
                    auVar93 = vpermpd_avx2(auVar95,0x4e);
                    auVar95 = vminps_avx(auVar95,auVar93);
                    uVar20 = vcmpps_avx512vl(auVar132,auVar95,0);
                    uVar73 = (uint)uVar75;
                    if ((bVar80 & (byte)uVar20) != 0) {
                      uVar73 = (uint)(bVar80 & (byte)uVar20);
                    }
                    uVar74 = 0;
                    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                      uVar74 = uVar74 + 1;
                    }
                    uVar71 = (ulong)uVar74;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_280;
                      local_468 = pGVar77;
                      do {
                        local_494 = local_200[uVar71];
                        local_490 = *(undefined4 *)(local_1e0 + uVar71 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                        local_4f0.context = context->user;
                        fVar167 = 1.0 - local_494;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(local_494 * (fVar167 + fVar167))),
                                                  ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                        auVar86 = ZEXT416((uint)local_494);
                        auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar86,
                                                  ZEXT416(0xc0a00000));
                        auVar85 = vfmadd231ss_fma(ZEXT416((uint)(local_494 * local_494 * 3.0)),
                                                  ZEXT416((uint)(local_494 + local_494)),auVar87);
                        auVar190 = ZEXT1664(auVar85);
                        auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar86,
                                                  ZEXT416(0x40000000));
                        auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * -3.0)),
                                                  ZEXT416((uint)(fVar167 + fVar167)),auVar87);
                        auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_494 * local_494)),auVar86,
                                                  ZEXT416((uint)(fVar167 * -2.0)));
                        fVar167 = auVar8._0_4_ * 0.5;
                        fVar146 = auVar85._0_4_ * 0.5;
                        auVar182 = ZEXT464((uint)fVar146);
                        fVar156 = auVar87._0_4_ * 0.5;
                        fVar81 = auVar86._0_4_ * 0.5;
                        auVar172._0_4_ = fVar81 * local_530;
                        auVar172._4_4_ = fVar81 * fStack_52c;
                        auVar172._8_4_ = fVar81 * fStack_528;
                        auVar172._12_4_ = fVar81 * fStack_524;
                        auVar185._4_4_ = fVar156;
                        auVar185._0_4_ = fVar156;
                        auVar185._8_4_ = fVar156;
                        auVar185._12_4_ = fVar156;
                        auVar68._8_8_ = uStack_518;
                        auVar68._0_8_ = local_520;
                        auVar87 = vfmadd132ps_fma(auVar185,auVar172,auVar68);
                        auVar187 = ZEXT1664(auVar87);
                        auVar173._4_4_ = fVar146;
                        auVar173._0_4_ = fVar146;
                        auVar173._8_4_ = fVar146;
                        auVar173._12_4_ = fVar146;
                        auVar86 = vfmadd213ps_fma(auVar173,auVar196._0_16_,auVar87);
                        auVar163._4_4_ = fVar167;
                        auVar163._0_4_ = fVar167;
                        auVar163._8_4_ = fVar167;
                        auVar163._12_4_ = fVar167;
                        auVar86 = vfmadd213ps_fma(auVar163,auVar194._0_16_,auVar86);
                        local_4a0 = vmovlps_avx(auVar86);
                        local_498 = vextractps_avx(auVar86,2);
                        local_48c = (int)local_538;
                        local_488 = (int)local_550;
                        local_484 = (local_4f0.context)->instID[0];
                        local_480 = (local_4f0.context)->instPrimID[0];
                        local_554 = -1;
                        local_4f0.valid = &local_554;
                        local_4f0.geometryUserPtr = pGVar77->userPtr;
                        local_4f0.ray = (RTCRayN *)ray;
                        local_4f0.hit = (RTCHitN *)&local_4a0;
                        local_4f0.N = 1;
                        if (pGVar77->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a4fa06:
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar182 = ZEXT1664(auVar182._0_16_);
                            auVar187 = ZEXT1664(auVar187._0_16_);
                            auVar190 = ZEXT1664(auVar190._0_16_);
                            (*p_Var13)(&local_4f0);
                            auVar203 = ZEXT3264(local_460);
                            auVar196 = ZEXT1664(local_4c0);
                            auVar194 = ZEXT1664(local_4b0);
                            context = local_548;
                            ray = local_540;
                            pGVar77 = local_468;
                            if (*local_4f0.valid == 0) goto LAB_01a4fac1;
                          }
                          (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_4f0.hit;
                          (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4f0.hit + 4);
                          (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4f0.hit + 8);
                          *(float *)((long)local_4f0.ray + 0x3c) = *(float *)(local_4f0.hit + 0xc);
                          *(float *)((long)local_4f0.ray + 0x40) = *(float *)(local_4f0.hit + 0x10);
                          *(float *)((long)local_4f0.ray + 0x44) = *(float *)(local_4f0.hit + 0x14);
                          *(float *)((long)local_4f0.ray + 0x48) = *(float *)(local_4f0.hit + 0x18);
                          *(float *)((long)local_4f0.ray + 0x4c) = *(float *)(local_4f0.hit + 0x1c);
                          *(float *)((long)local_4f0.ray + 0x50) = *(float *)(local_4f0.hit + 0x20);
                        }
                        else {
                          auVar182 = ZEXT464((uint)fVar146);
                          auVar187 = ZEXT1664(auVar87);
                          auVar190 = ZEXT1664(auVar85);
                          (*pGVar77->intersectionFilterN)(&local_4f0);
                          auVar203 = ZEXT3264(local_460);
                          auVar196 = ZEXT1664(local_4c0);
                          auVar194 = ZEXT1664(local_4b0);
                          context = local_548;
                          ray = local_540;
                          pGVar77 = local_468;
                          if (*local_4f0.valid != 0) goto LAB_01a4fa06;
LAB_01a4fac1:
                          (local_540->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_548;
                          ray = local_540;
                          pGVar77 = local_468;
                        }
                        bVar80 = ~(byte)(1 << ((uint)uVar71 & 0x1f)) & (byte)uVar75;
                        fVar167 = (ray->super_RayK<1>).tfar;
                        auVar33._4_4_ = fVar167;
                        auVar33._0_4_ = fVar167;
                        auVar33._8_4_ = fVar167;
                        auVar33._12_4_ = fVar167;
                        auVar33._16_4_ = fVar167;
                        auVar33._20_4_ = fVar167;
                        auVar33._24_4_ = fVar167;
                        auVar33._28_4_ = fVar167;
                        uVar20 = vcmpps_avx512vl(auVar203._0_32_,auVar33,2);
                        pre = local_508;
                        prim = local_500;
                        if ((bVar80 & (byte)uVar20) == 0) goto LAB_01a4f819;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar80 = bVar80 & (byte)uVar20;
                        uVar75 = (ulong)bVar80;
                        auVar154._8_4_ = 0x7f800000;
                        auVar154._0_8_ = 0x7f8000007f800000;
                        auVar154._12_4_ = 0x7f800000;
                        auVar154._16_4_ = 0x7f800000;
                        auVar154._20_4_ = 0x7f800000;
                        auVar154._24_4_ = 0x7f800000;
                        auVar154._28_4_ = 0x7f800000;
                        auVar95 = vblendmps_avx512vl(auVar154,auVar203._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar80 & 1) * auVar95._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar80 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar80 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar80 >> 3 & 1);
                        auVar133._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar80 >> 4 & 1);
                        auVar133._16_4_ = (uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar80 >> 5 & 1);
                        auVar133._20_4_ = (uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar80 >> 6 & 1);
                        auVar133._24_4_ = (uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        auVar133._28_4_ =
                             (uint)(bVar80 >> 7) * auVar95._28_4_ |
                             (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                        auVar95 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar95 = vminps_avx(auVar133,auVar95);
                        auVar93 = vshufpd_avx(auVar95,auVar95,5);
                        auVar95 = vminps_avx(auVar95,auVar93);
                        auVar93 = vpermpd_avx2(auVar95,0x4e);
                        auVar95 = vminps_avx(auVar95,auVar93);
                        uVar20 = vcmpps_avx512vl(auVar133,auVar95,0);
                        bVar70 = (byte)uVar20 & bVar80;
                        if (bVar70 != 0) {
                          bVar80 = bVar70;
                        }
                        uVar73 = 0;
                        for (uVar74 = (uint)bVar80; (uVar74 & 1) == 0;
                            uVar74 = uVar74 >> 1 | 0x80000000) {
                          uVar73 = uVar73 + 1;
                        }
                        uVar71 = (ulong)uVar73;
                      } while( true );
                    }
                    fVar167 = local_200[uVar71];
                    fVar146 = *(float *)(local_1e0 + uVar71 * 4);
                    fVar156 = 1.0 - fVar167;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar167 * (fVar156 + fVar156))),
                                              ZEXT416((uint)fVar156),ZEXT416((uint)fVar156));
                    auVar85 = ZEXT416((uint)fVar167);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                              ZEXT416(0xc0a00000));
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * 3.0)),
                                              ZEXT416((uint)(fVar167 + fVar167)),auVar87);
                    auVar190 = ZEXT1664(auVar86);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                              ZEXT416(0x40000000));
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * -3.0)),
                                              ZEXT416((uint)(fVar156 + fVar156)),auVar87);
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),auVar85,
                                              ZEXT416((uint)(fVar156 * -2.0)));
                    fVar156 = auVar8._0_4_ * 0.5;
                    fVar81 = auVar86._0_4_ * 0.5;
                    fVar82 = auVar87._0_4_ * 0.5;
                    fVar135 = auVar85._0_4_ * 0.5;
                    auVar170._0_4_ = fVar135 * local_530;
                    auVar170._4_4_ = fVar135 * fStack_52c;
                    auVar170._8_4_ = fVar135 * fStack_528;
                    auVar170._12_4_ = fVar135 * fStack_524;
                    auVar184._4_4_ = fVar82;
                    auVar184._0_4_ = fVar82;
                    auVar184._8_4_ = fVar82;
                    auVar184._12_4_ = fVar82;
                    auVar67._8_8_ = uStack_518;
                    auVar67._0_8_ = local_520;
                    auVar87 = vfmadd132ps_fma(auVar184,auVar170,auVar67);
                    auVar187 = ZEXT1664(auVar87);
                    auVar171._4_4_ = fVar81;
                    auVar171._0_4_ = fVar81;
                    auVar171._8_4_ = fVar81;
                    auVar171._12_4_ = fVar81;
                    auVar87 = vfmadd213ps_fma(auVar171,local_4c0,auVar87);
                    auVar162._4_4_ = fVar156;
                    auVar162._0_4_ = fVar156;
                    auVar162._8_4_ = fVar156;
                    auVar162._12_4_ = fVar156;
                    auVar182 = ZEXT464((uint)*(float *)(local_1c0 + uVar71 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                    auVar87 = vfmadd213ps_fma(auVar162,local_4b0,auVar87);
                    uVar20 = vmovlps_avx(auVar87);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                    fVar156 = (float)vextractps_avx(auVar87,2);
                    (ray->Ng).field_0.field_0.z = fVar156;
                    ray->u = fVar167;
                    ray->v = fVar146;
                    ray->primID = (uint)local_538;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
LAB_01a4f819:
      }
    }
    fVar167 = (ray->super_RayK<1>).tfar;
    auVar28._4_4_ = fVar167;
    auVar28._0_4_ = fVar167;
    auVar28._8_4_ = fVar167;
    auVar28._12_4_ = fVar167;
    auVar28._16_4_ = fVar167;
    auVar28._20_4_ = fVar167;
    auVar28._24_4_ = fVar167;
    auVar28._28_4_ = fVar167;
    uVar20 = vcmpps_avx512vl(local_80,auVar28,2);
    uVar79 = (ulong)((uint)uVar79 & (uint)uVar20);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }